

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersector1<8>::
     intersect_h<embree::avx512::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  int iVar13;
  RTCFilterFunctionN p_Var14;
  byte bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  uint uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  long lVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  byte bVar80;
  ulong uVar81;
  long lVar82;
  uint uVar83;
  uint uVar84;
  ulong uVar85;
  long lVar86;
  long lVar87;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  ulong uVar88;
  Geometry *pGVar89;
  uint uVar90;
  byte bVar91;
  float fVar92;
  float fVar93;
  float fVar141;
  float fVar143;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar99 [16];
  float fVar142;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar147;
  undefined4 uVar148;
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar166;
  float fVar167;
  float fVar176;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar174;
  float fVar175;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  int local_5fc;
  Precalculations *local_5f8;
  Primitive *local_5f0;
  ulong local_5e8;
  ulong local_5e0;
  ulong local_5d8;
  RTCFilterFunctionNArguments local_5d0;
  undefined1 local_5a0 [16];
  undefined8 local_590;
  undefined4 local_588;
  float local_584;
  undefined4 local_580;
  undefined4 local_57c;
  undefined4 local_578;
  uint local_574;
  uint local_570;
  Geometry *local_558;
  undefined1 local_550 [8];
  undefined8 uStack_548;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined4 local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined4 local_2c0;
  int local_2bc;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  byte local_270;
  float local_260 [4];
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar12 = prim[1];
  uVar85 = (ulong)(byte)PVar12;
  fVar167 = *(float *)(prim + uVar85 * 0x19 + 0x12);
  auVar149 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar85 * 0x19 + 6));
  fVar166 = fVar167 * auVar149._0_4_;
  fVar147 = fVar167 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar85 * 4 + 6);
  auVar105 = vpmovsxbd_avx2(auVar96);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar85 * 5 + 6);
  auVar103 = vpmovsxbd_avx2(auVar94);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = *(ulong *)(prim + uVar85 * 6 + 6);
  auVar116 = vpmovsxbd_avx2(auVar204);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar85 * 0xb + 6);
  auVar115 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar12 * 0xc) + 6);
  auVar109 = vpmovsxbd_avx2(auVar7);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar106 = vcvtdq2ps_avx(auVar109);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (uint)(byte)PVar12 * 0xc + uVar85 + 6);
  auVar104 = vpmovsxbd_avx2(auVar8);
  auVar104 = vcvtdq2ps_avx(auVar104);
  uVar88 = (ulong)(uint)((int)(uVar85 * 9) * 2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar88 + 6);
  auVar114 = vpmovsxbd_avx2(auVar9);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar88 + uVar85 + 6);
  auVar107 = vpmovsxbd_avx2(auVar10);
  auVar107 = vcvtdq2ps_avx(auVar107);
  uVar81 = (ulong)(uint)((int)(uVar85 * 5) << 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar81 + 6);
  auVar102 = vpmovsxbd_avx2(auVar11);
  auVar108 = vcvtdq2ps_avx(auVar102);
  auVar200._4_4_ = fVar147;
  auVar200._0_4_ = fVar147;
  auVar200._8_4_ = fVar147;
  auVar200._12_4_ = fVar147;
  auVar200._16_4_ = fVar147;
  auVar200._20_4_ = fVar147;
  auVar200._24_4_ = fVar147;
  auVar200._28_4_ = fVar147;
  auVar202._8_4_ = 1;
  auVar202._0_8_ = 0x100000001;
  auVar202._12_4_ = 1;
  auVar202._16_4_ = 1;
  auVar202._20_4_ = 1;
  auVar202._24_4_ = 1;
  auVar202._28_4_ = 1;
  auVar100 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar111 = ZEXT1632(CONCAT412(fVar167 * (ray->super_RayK<1>).dir.field_0.m128[3],
                                CONCAT48(fVar167 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                         CONCAT44(fVar167 * (ray->super_RayK<1>).dir.field_0.m128[1]
                                                  ,fVar147))));
  auVar110 = vpermps_avx2(auVar202,auVar111);
  auVar101 = vpermps_avx512vl(auVar100,auVar111);
  fVar147 = auVar101._0_4_;
  fVar181 = auVar101._4_4_;
  auVar111._4_4_ = fVar181 * auVar116._4_4_;
  auVar111._0_4_ = fVar147 * auVar116._0_4_;
  fVar182 = auVar101._8_4_;
  auVar111._8_4_ = fVar182 * auVar116._8_4_;
  fVar183 = auVar101._12_4_;
  auVar111._12_4_ = fVar183 * auVar116._12_4_;
  fVar174 = auVar101._16_4_;
  auVar111._16_4_ = fVar174 * auVar116._16_4_;
  fVar175 = auVar101._20_4_;
  auVar111._20_4_ = fVar175 * auVar116._20_4_;
  fVar176 = auVar101._24_4_;
  auVar111._24_4_ = fVar176 * auVar116._24_4_;
  auVar111._28_4_ = auVar109._28_4_;
  auVar109._4_4_ = auVar104._4_4_ * fVar181;
  auVar109._0_4_ = auVar104._0_4_ * fVar147;
  auVar109._8_4_ = auVar104._8_4_ * fVar182;
  auVar109._12_4_ = auVar104._12_4_ * fVar183;
  auVar109._16_4_ = auVar104._16_4_ * fVar174;
  auVar109._20_4_ = auVar104._20_4_ * fVar175;
  auVar109._24_4_ = auVar104._24_4_ * fVar176;
  auVar109._28_4_ = auVar102._28_4_;
  auVar102._4_4_ = auVar108._4_4_ * fVar181;
  auVar102._0_4_ = auVar108._0_4_ * fVar147;
  auVar102._8_4_ = auVar108._8_4_ * fVar182;
  auVar102._12_4_ = auVar108._12_4_ * fVar183;
  auVar102._16_4_ = auVar108._16_4_ * fVar174;
  auVar102._20_4_ = auVar108._20_4_ * fVar175;
  auVar102._24_4_ = auVar108._24_4_ * fVar176;
  auVar102._28_4_ = auVar101._28_4_;
  auVar96 = vfmadd231ps_fma(auVar111,auVar110,auVar103);
  auVar94 = vfmadd231ps_fma(auVar109,auVar110,auVar106);
  auVar204 = vfmadd231ps_fma(auVar102,auVar107,auVar110);
  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar200,auVar105);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar200,auVar115);
  auVar204 = vfmadd231ps_fma(ZEXT1632(auVar204),auVar114,auVar200);
  auVar201._4_4_ = fVar166;
  auVar201._0_4_ = fVar166;
  auVar201._8_4_ = fVar166;
  auVar201._12_4_ = fVar166;
  auVar201._16_4_ = fVar166;
  auVar201._20_4_ = fVar166;
  auVar201._24_4_ = fVar166;
  auVar201._28_4_ = fVar166;
  auVar102 = ZEXT1632(CONCAT412(fVar167 * auVar149._12_4_,
                                CONCAT48(fVar167 * auVar149._8_4_,
                                         CONCAT44(fVar167 * auVar149._4_4_,fVar166))));
  auVar109 = vpermps_avx2(auVar202,auVar102);
  auVar102 = vpermps_avx512vl(auVar100,auVar102);
  fVar167 = auVar102._0_4_;
  fVar147 = auVar102._4_4_;
  auVar110._4_4_ = fVar147 * auVar116._4_4_;
  auVar110._0_4_ = fVar167 * auVar116._0_4_;
  fVar181 = auVar102._8_4_;
  auVar110._8_4_ = fVar181 * auVar116._8_4_;
  fVar182 = auVar102._12_4_;
  auVar110._12_4_ = fVar182 * auVar116._12_4_;
  fVar183 = auVar102._16_4_;
  auVar110._16_4_ = fVar183 * auVar116._16_4_;
  fVar174 = auVar102._20_4_;
  auVar110._20_4_ = fVar174 * auVar116._20_4_;
  fVar175 = auVar102._24_4_;
  auVar110._24_4_ = fVar175 * auVar116._24_4_;
  auVar110._28_4_ = 1;
  auVar100._4_4_ = auVar104._4_4_ * fVar147;
  auVar100._0_4_ = auVar104._0_4_ * fVar167;
  auVar100._8_4_ = auVar104._8_4_ * fVar181;
  auVar100._12_4_ = auVar104._12_4_ * fVar182;
  auVar100._16_4_ = auVar104._16_4_ * fVar183;
  auVar100._20_4_ = auVar104._20_4_ * fVar174;
  auVar100._24_4_ = auVar104._24_4_ * fVar175;
  auVar100._28_4_ = auVar116._28_4_;
  auVar104._4_4_ = auVar108._4_4_ * fVar147;
  auVar104._0_4_ = auVar108._0_4_ * fVar167;
  auVar104._8_4_ = auVar108._8_4_ * fVar181;
  auVar104._12_4_ = auVar108._12_4_ * fVar182;
  auVar104._16_4_ = auVar108._16_4_ * fVar183;
  auVar104._20_4_ = auVar108._20_4_ * fVar174;
  auVar104._24_4_ = auVar108._24_4_ * fVar175;
  auVar104._28_4_ = auVar102._28_4_;
  auVar6 = vfmadd231ps_fma(auVar110,auVar109,auVar103);
  auVar7 = vfmadd231ps_fma(auVar100,auVar109,auVar106);
  auVar8 = vfmadd231ps_fma(auVar104,auVar109,auVar107);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar201,auVar105);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar201,auVar115);
  auVar192._8_4_ = 0x7fffffff;
  auVar192._0_8_ = 0x7fffffff7fffffff;
  auVar192._12_4_ = 0x7fffffff;
  auVar192._16_4_ = 0x7fffffff;
  auVar192._20_4_ = 0x7fffffff;
  auVar192._24_4_ = 0x7fffffff;
  auVar192._28_4_ = 0x7fffffff;
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar201,auVar114);
  auVar105 = vandps_avx(ZEXT1632(auVar96),auVar192);
  auVar188._8_4_ = 0x219392ef;
  auVar188._0_8_ = 0x219392ef219392ef;
  auVar188._12_4_ = 0x219392ef;
  auVar188._16_4_ = 0x219392ef;
  auVar188._20_4_ = 0x219392ef;
  auVar188._24_4_ = 0x219392ef;
  auVar188._28_4_ = 0x219392ef;
  uVar88 = vcmpps_avx512vl(auVar105,auVar188,1);
  bVar16 = (bool)((byte)uVar88 & 1);
  auVar101._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar96._0_4_;
  bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar96._4_4_;
  bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar96._8_4_;
  bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar96._12_4_;
  auVar101._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar101._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar101._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar101._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar105 = vandps_avx(ZEXT1632(auVar94),auVar192);
  uVar88 = vcmpps_avx512vl(auVar105,auVar188,1);
  bVar16 = (bool)((byte)uVar88 & 1);
  auVar112._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar94._0_4_;
  bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar112._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar94._4_4_;
  bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar112._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar94._8_4_;
  bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar112._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar94._12_4_;
  auVar112._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar112._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar112._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar112._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar105 = vandps_avx(ZEXT1632(auVar204),auVar192);
  uVar88 = vcmpps_avx512vl(auVar105,auVar188,1);
  bVar16 = (bool)((byte)uVar88 & 1);
  auVar105._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar204._0_4_;
  bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar105._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar204._4_4_;
  bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar105._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar204._8_4_;
  bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar105._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar204._12_4_;
  auVar105._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar105._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar105._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar105._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar103 = vrcp14ps_avx512vl(auVar101);
  auVar189._8_4_ = 0x3f800000;
  auVar189._0_8_ = &DAT_3f8000003f800000;
  auVar189._12_4_ = 0x3f800000;
  auVar189._16_4_ = 0x3f800000;
  auVar189._20_4_ = 0x3f800000;
  auVar189._24_4_ = 0x3f800000;
  auVar189._28_4_ = 0x3f800000;
  auVar96 = vfnmadd213ps_fma(auVar101,auVar103,auVar189);
  auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar103,auVar103);
  auVar103 = vrcp14ps_avx512vl(auVar112);
  auVar94 = vfnmadd213ps_fma(auVar112,auVar103,auVar189);
  auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar103,auVar103);
  auVar103 = vrcp14ps_avx512vl(auVar105);
  auVar204 = vfnmadd213ps_fma(auVar105,auVar103,auVar189);
  auVar204 = vfmadd132ps_fma(ZEXT1632(auVar204),auVar103,auVar103);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 7 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar6));
  auVar114._4_4_ = auVar96._4_4_ * auVar105._4_4_;
  auVar114._0_4_ = auVar96._0_4_ * auVar105._0_4_;
  auVar114._8_4_ = auVar96._8_4_ * auVar105._8_4_;
  auVar114._12_4_ = auVar96._12_4_ * auVar105._12_4_;
  auVar114._16_4_ = auVar105._16_4_ * 0.0;
  auVar114._20_4_ = auVar105._20_4_ * 0.0;
  auVar114._24_4_ = auVar105._24_4_ * 0.0;
  auVar114._28_4_ = auVar105._28_4_;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 9 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar6));
  auVar104 = vpbroadcastd_avx512vl();
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar12 * 0x10 + 6));
  auVar128._0_4_ = auVar96._0_4_ * auVar105._0_4_;
  auVar128._4_4_ = auVar96._4_4_ * auVar105._4_4_;
  auVar128._8_4_ = auVar96._8_4_ * auVar105._8_4_;
  auVar128._12_4_ = auVar96._12_4_ * auVar105._12_4_;
  auVar128._16_4_ = auVar105._16_4_ * 0.0;
  auVar128._20_4_ = auVar105._20_4_ * 0.0;
  auVar128._24_4_ = auVar105._24_4_ * 0.0;
  auVar128._28_4_ = 0;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar12 * 0x10 + uVar85 * -2 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar7));
  auVar107._4_4_ = auVar94._4_4_ * auVar105._4_4_;
  auVar107._0_4_ = auVar94._0_4_ * auVar105._0_4_;
  auVar107._8_4_ = auVar94._8_4_ * auVar105._8_4_;
  auVar107._12_4_ = auVar94._12_4_ * auVar105._12_4_;
  auVar107._16_4_ = auVar105._16_4_ * 0.0;
  auVar107._20_4_ = auVar105._20_4_ * 0.0;
  auVar107._24_4_ = auVar105._24_4_ * 0.0;
  auVar107._28_4_ = auVar105._28_4_;
  auVar105 = vcvtdq2ps_avx(auVar103);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar7));
  auVar127._0_4_ = auVar94._0_4_ * auVar105._0_4_;
  auVar127._4_4_ = auVar94._4_4_ * auVar105._4_4_;
  auVar127._8_4_ = auVar94._8_4_ * auVar105._8_4_;
  auVar127._12_4_ = auVar94._12_4_ * auVar105._12_4_;
  auVar127._16_4_ = auVar105._16_4_ * 0.0;
  auVar127._20_4_ = auVar105._20_4_ * 0.0;
  auVar127._24_4_ = auVar105._24_4_ * 0.0;
  auVar127._28_4_ = 0;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 + uVar85 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar8));
  auVar108._4_4_ = auVar105._4_4_ * auVar204._4_4_;
  auVar108._0_4_ = auVar105._0_4_ * auVar204._0_4_;
  auVar108._8_4_ = auVar105._8_4_ * auVar204._8_4_;
  auVar108._12_4_ = auVar105._12_4_ * auVar204._12_4_;
  auVar108._16_4_ = auVar105._16_4_ * 0.0;
  auVar108._20_4_ = auVar105._20_4_ * 0.0;
  auVar108._24_4_ = auVar105._24_4_ * 0.0;
  auVar108._28_4_ = auVar105._28_4_;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 0x17 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar8));
  auVar113._0_4_ = auVar204._0_4_ * auVar105._0_4_;
  auVar113._4_4_ = auVar204._4_4_ * auVar105._4_4_;
  auVar113._8_4_ = auVar204._8_4_ * auVar105._8_4_;
  auVar113._12_4_ = auVar204._12_4_ * auVar105._12_4_;
  auVar113._16_4_ = auVar105._16_4_ * 0.0;
  auVar113._20_4_ = auVar105._20_4_ * 0.0;
  auVar113._24_4_ = auVar105._24_4_ * 0.0;
  auVar113._28_4_ = 0;
  auVar105 = vpminsd_avx2(auVar114,auVar128);
  auVar103 = vpminsd_avx2(auVar107,auVar127);
  auVar105 = vmaxps_avx(auVar105,auVar103);
  auVar103 = vpminsd_avx2(auVar108,auVar113);
  uVar148 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar116._4_4_ = uVar148;
  auVar116._0_4_ = uVar148;
  auVar116._8_4_ = uVar148;
  auVar116._12_4_ = uVar148;
  auVar116._16_4_ = uVar148;
  auVar116._20_4_ = uVar148;
  auVar116._24_4_ = uVar148;
  auVar116._28_4_ = uVar148;
  auVar103 = vmaxps_avx512vl(auVar103,auVar116);
  auVar105 = vmaxps_avx(auVar105,auVar103);
  auVar103._8_4_ = 0x3f7ffffa;
  auVar103._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar103._12_4_ = 0x3f7ffffa;
  auVar103._16_4_ = 0x3f7ffffa;
  auVar103._20_4_ = 0x3f7ffffa;
  auVar103._24_4_ = 0x3f7ffffa;
  auVar103._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar105,auVar103);
  auVar105 = vpmaxsd_avx2(auVar114,auVar128);
  auVar103 = vpmaxsd_avx2(auVar107,auVar127);
  auVar105 = vminps_avx(auVar105,auVar103);
  auVar103 = vpmaxsd_avx2(auVar108,auVar113);
  fVar167 = (ray->super_RayK<1>).tfar;
  auVar115._4_4_ = fVar167;
  auVar115._0_4_ = fVar167;
  auVar115._8_4_ = fVar167;
  auVar115._12_4_ = fVar167;
  auVar115._16_4_ = fVar167;
  auVar115._20_4_ = fVar167;
  auVar115._24_4_ = fVar167;
  auVar115._28_4_ = fVar167;
  auVar103 = vminps_avx512vl(auVar103,auVar115);
  auVar105 = vminps_avx(auVar105,auVar103);
  auVar106._8_4_ = 0x3f800003;
  auVar106._0_8_ = 0x3f8000033f800003;
  auVar106._12_4_ = 0x3f800003;
  auVar106._16_4_ = 0x3f800003;
  auVar106._20_4_ = 0x3f800003;
  auVar106._24_4_ = 0x3f800003;
  auVar106._28_4_ = 0x3f800003;
  auVar105 = vmulps_avx512vl(auVar105,auVar106);
  uVar24 = vpcmpgtd_avx512vl(auVar104,_DAT_0205a920);
  uVar23 = vcmpps_avx512vl(local_80,auVar105,2);
  if ((byte)((byte)uVar23 & (byte)uVar24) != 0) {
    uVar88 = (ulong)(byte)((byte)uVar23 & (byte)uVar24);
    do {
      lVar87 = 0;
      for (uVar81 = uVar88; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
        lVar87 = lVar87 + 1;
      }
      uVar90 = *(uint *)(prim + 2);
      uVar84 = *(uint *)(prim + lVar87 * 4 + 6);
      local_5e0 = (ulong)uVar90;
      pGVar89 = (context->scene->geometries).items[uVar90].ptr;
      local_5d8 = (ulong)uVar84;
      uVar81 = (ulong)*(uint *)(*(long *)&pGVar89->field_0x58 +
                               (ulong)uVar84 *
                               pGVar89[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar82 = (long)pGVar89[1].intersectionFilterN * uVar81;
      lVar86 = (long)pGVar89[1].intersectionFilterN * (uVar81 + 1);
      iVar13 = (int)pGVar89[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar73 = (long)iVar13 * 0x44;
      lVar87 = *(long *)&pGVar89[1].time_range.upper;
      local_5a0 = *(undefined1 (*) [16])(lVar87 + lVar82);
      _local_550 = *(undefined1 (*) [16])(lVar87 + lVar86);
      auVar149._8_4_ = 0xbeaaaaab;
      auVar149._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar149._12_4_ = 0xbeaaaaab;
      local_530 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                    (pGVar89[2].intersectionFilterN +
                                    uVar81 * (long)pGVar89[2].pointQueryFunc),local_5a0,auVar149);
      local_540 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                   (pGVar89[2].intersectionFilterN +
                                   (long)pGVar89[2].pointQueryFunc * (uVar81 + 1)),_local_550,
                                  auVar149);
      aVar3 = (ray->super_RayK<1>).org.field_0;
      auVar11 = local_5a0;
      auVar94 = vsubps_avx(local_5a0,(undefined1  [16])aVar3);
      uVar148 = auVar94._0_4_;
      auVar157._4_4_ = uVar148;
      auVar157._0_4_ = uVar148;
      auVar157._8_4_ = uVar148;
      auVar157._12_4_ = uVar148;
      auVar96 = vshufps_avx(auVar94,auVar94,0x55);
      aVar4 = (pre->ray_space).vx.field_0;
      aVar5 = (pre->ray_space).vy.field_0;
      fVar167 = (pre->ray_space).vz.field_0.m128[0];
      fVar147 = (pre->ray_space).vz.field_0.m128[1];
      fVar181 = (pre->ray_space).vz.field_0.m128[2];
      fVar182 = (pre->ray_space).vz.field_0.m128[3];
      auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
      auVar197._0_4_ = auVar94._0_4_ * fVar167;
      auVar197._4_4_ = auVar94._4_4_ * fVar147;
      auVar197._8_4_ = auVar94._8_4_ * fVar181;
      auVar197._12_4_ = auVar94._12_4_ * fVar182;
      auVar96 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar5,auVar96);
      auVar204 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar4,auVar157);
      auVar94 = vsubps_avx(local_530,(undefined1  [16])aVar3);
      uVar148 = auVar94._0_4_;
      auVar97._4_4_ = uVar148;
      auVar97._0_4_ = uVar148;
      auVar97._8_4_ = uVar148;
      auVar97._12_4_ = uVar148;
      auVar96 = vshufps_avx(auVar94,auVar94,0x55);
      auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
      auVar198._0_4_ = auVar94._0_4_ * fVar167;
      auVar198._4_4_ = auVar94._4_4_ * fVar147;
      auVar198._8_4_ = auVar94._8_4_ * fVar181;
      auVar198._12_4_ = auVar94._12_4_ * fVar182;
      auVar96 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar5,auVar96);
      auVar6 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar4,auVar97);
      auVar94 = vsubps_avx(local_540,(undefined1  [16])aVar3);
      uVar148 = auVar94._0_4_;
      auVar98._4_4_ = uVar148;
      auVar98._0_4_ = uVar148;
      auVar98._8_4_ = uVar148;
      auVar98._12_4_ = uVar148;
      auVar96 = vshufps_avx(auVar94,auVar94,0x55);
      auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
      auVar199._0_4_ = auVar94._0_4_ * fVar167;
      auVar199._4_4_ = auVar94._4_4_ * fVar147;
      auVar199._8_4_ = auVar94._8_4_ * fVar181;
      auVar199._12_4_ = auVar94._12_4_ * fVar182;
      auVar96 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar5,auVar96);
      auVar7 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar4,auVar98);
      auVar149 = _local_550;
      auVar94 = vsubps_avx(_local_550,(undefined1  [16])aVar3);
      uVar148 = auVar94._0_4_;
      auVar95._4_4_ = uVar148;
      auVar95._0_4_ = uVar148;
      auVar95._8_4_ = uVar148;
      auVar95._12_4_ = uVar148;
      auVar96 = vshufps_avx(auVar94,auVar94,0x55);
      auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
      auVar99._0_4_ = auVar94._0_4_ * fVar167;
      auVar99._4_4_ = auVar94._4_4_ * fVar147;
      auVar99._8_4_ = auVar94._8_4_ * fVar181;
      auVar99._12_4_ = auVar94._12_4_ * fVar182;
      auVar96 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar5,auVar96);
      auVar8 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar4,auVar95);
      auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar73);
      uVar148 = auVar204._0_4_;
      local_360._4_4_ = uVar148;
      local_360._0_4_ = uVar148;
      local_360._8_4_ = uVar148;
      local_360._12_4_ = uVar148;
      local_360._16_4_ = uVar148;
      local_360._20_4_ = uVar148;
      local_360._24_4_ = uVar148;
      local_360._28_4_ = uVar148;
      auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x484);
      auVar150._8_4_ = 1;
      auVar150._0_8_ = 0x100000001;
      auVar150._12_4_ = 1;
      auVar150._16_4_ = 1;
      auVar150._20_4_ = 1;
      auVar150._24_4_ = 1;
      auVar150._28_4_ = 1;
      local_380 = vpermps_avx512vl(auVar150,ZEXT1632(auVar204));
      local_3a0 = vbroadcastss_avx512vl(auVar6);
      local_3c0 = vpermps_avx512vl(auVar150,ZEXT1632(auVar6));
      auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x908);
      local_480 = vbroadcastss_avx512vl(auVar7);
      auVar209 = ZEXT3264(local_480);
      local_4a0 = vpermps_avx512vl(auVar150,ZEXT1632(auVar7));
      auVar210 = ZEXT3264(local_4a0);
      auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0xd8c);
      local_4c0 = vbroadcastss_avx512vl(auVar8);
      auVar211 = ZEXT3264(local_4c0);
      local_4e0 = vpermps_avx512vl(auVar150,ZEXT1632(auVar8));
      auVar212 = ZEXT3264(local_4e0);
      auVar106 = vmulps_avx512vl(local_4c0,auVar115);
      auVar104 = vmulps_avx512vl(local_4e0,auVar115);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar116,local_480);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar116,local_4a0);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,local_3a0);
      auVar107 = vfmadd231ps_avx512vl(auVar104,auVar103,local_3c0);
      auVar9 = vfmadd231ps_fma(auVar106,auVar105,local_360);
      auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar73);
      auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x484);
      auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x908);
      auVar108 = vfmadd231ps_avx512vl(auVar107,auVar105,local_380);
      auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0xd8c);
      auVar109 = vmulps_avx512vl(local_4c0,auVar107);
      auVar102 = vmulps_avx512vl(local_4e0,auVar107);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar114,local_480);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar114,local_4a0);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar104,local_3a0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar104,local_3c0);
      auVar10 = vfmadd231ps_fma(auVar109,auVar106,local_360);
      auVar109 = vfmadd231ps_avx512vl(auVar102,auVar106,local_380);
      auVar102 = vsubps_avx512vl(ZEXT1632(auVar10),ZEXT1632(auVar9));
      auVar110 = vsubps_avx512vl(auVar109,auVar108);
      auVar111 = vmulps_avx512vl(auVar108,auVar102);
      auVar100 = vmulps_avx512vl(ZEXT1632(auVar9),auVar110);
      auVar111 = vsubps_avx512vl(auVar111,auVar100);
      auVar96 = vshufps_avx(local_530,local_530,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar96);
      auVar96 = vshufps_avx(local_540,local_540,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar96);
      _local_e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar87 + 0xc + lVar86)));
      auVar100 = vmulps_avx512vl(_local_e0,auVar115);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar116,local_c0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar103,local_a0);
      local_100 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar87 + 0xc + lVar82)));
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar105,local_100);
      auVar101 = vmulps_avx512vl(_local_e0,auVar107);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar114,local_c0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar104,local_a0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar106,local_100);
      auVar112 = vmulps_avx512vl(auVar110,auVar110);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar102,auVar102);
      auVar113 = vmaxps_avx512vl(auVar100,auVar101);
      auVar113 = vmulps_avx512vl(auVar113,auVar113);
      auVar112 = vmulps_avx512vl(auVar113,auVar112);
      auVar111 = vmulps_avx512vl(auVar111,auVar111);
      uVar23 = vcmpps_avx512vl(auVar111,auVar112,2);
      auVar96 = vinsertps_avx512f(auVar204,local_100._0_16_,0x30);
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar95 = vandps_avx512vl(auVar96,auVar94);
      auVar157 = local_530;
      auVar96 = vblendps_avx(auVar6,local_530,8);
      auVar96 = vandps_avx512vl(auVar96,auVar94);
      auVar97 = vmaxps_avx512vl(auVar95,auVar96);
      auVar95 = local_540;
      auVar96 = vblendps_avx(auVar7,local_540,8);
      auVar98 = vandps_avx512vl(auVar96,auVar94);
      auVar96 = vinsertps_avx512f(auVar8,local_e0._0_16_,0x30);
      auVar96 = vandps_avx512vl(auVar96,auVar94);
      auVar96 = vmaxps_avx512vl(auVar98,auVar96);
      auVar96 = vmaxps_avx(auVar97,auVar96);
      auVar94 = vmovshdup_avx(auVar96);
      auVar94 = vmaxss_avx(auVar94,auVar96);
      auVar96 = vshufpd_avx(auVar96,auVar96,1);
      auVar96 = vmaxss_avx(auVar96,auVar94);
      _local_340 = vcvtsi2ss_avx512f(in_ZMM23._0_16_,iVar13);
      auVar195._0_4_ = local_340._0_4_;
      auVar195._4_4_ = auVar195._0_4_;
      auVar195._8_4_ = auVar195._0_4_;
      auVar195._12_4_ = auVar195._0_4_;
      auVar195._16_4_ = auVar195._0_4_;
      auVar195._20_4_ = auVar195._0_4_;
      auVar195._24_4_ = auVar195._0_4_;
      auVar195._28_4_ = auVar195._0_4_;
      uVar24 = vcmpps_avx512vl(auVar195,_DAT_02020f40,0xe);
      bVar91 = (byte)uVar23 & (byte)uVar24;
      auVar96 = vmulss_avx512f(auVar96,ZEXT416(0x35000000));
      auVar194._8_4_ = 2;
      auVar194._0_8_ = 0x200000002;
      auVar194._12_4_ = 2;
      auVar194._16_4_ = 2;
      auVar194._20_4_ = 2;
      auVar194._24_4_ = 2;
      auVar194._28_4_ = 2;
      local_160 = vpermps_avx2(auVar194,ZEXT1632(auVar204));
      local_180 = vpermps_avx2(auVar194,ZEXT1632(auVar6));
      local_120 = vpermps_avx512vl(auVar194,ZEXT1632(auVar7));
      local_140 = vpermps_avx512vl(auVar194,ZEXT1632(auVar8));
      uVar148 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      local_1e0 = auVar96._0_4_;
      uStack_1dc = auVar96._4_4_;
      uStack_1d8 = auVar96._8_4_;
      uStack_1d4 = auVar96._12_4_;
      if (bVar91 == 0) {
        auVar96 = vxorps_avx512vl(auVar107._0_16_,auVar107._0_16_);
        auVar205 = ZEXT1664(auVar96);
        auVar206 = ZEXT3264(local_360);
        auVar207 = ZEXT3264(local_380);
        auVar208 = ZEXT3264(local_3a0);
        auVar213 = ZEXT3264(local_3c0);
        local_5a0 = auVar11;
      }
      else {
        local_400 = uVar148;
        uStack_3fc = 0;
        uStack_3f8 = 0;
        uStack_3f4 = 0;
        auVar107 = vmulps_avx512vl(local_140,auVar107);
        auVar114 = vfmadd213ps_avx512vl(auVar114,local_120,auVar107);
        in_ZMM23 = ZEXT3264(local_180);
        auVar104 = vfmadd213ps_avx512vl(auVar104,local_180,auVar114);
        auVar104 = vfmadd213ps_avx512vl(auVar106,local_160,auVar104);
        auVar115 = vmulps_avx512vl(local_140,auVar115);
        auVar116 = vfmadd213ps_avx512vl(auVar116,local_120,auVar115);
        auVar114 = vfmadd213ps_avx512vl(auVar103,local_180,auVar116);
        auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x1210);
        auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x1694);
        auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x1b18);
        auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x1f9c);
        auVar114 = vfmadd213ps_avx512vl(auVar105,local_160,auVar114);
        auVar105 = vmulps_avx512vl(local_4c0,auVar106);
        auVar107 = vmulps_avx512vl(local_4e0,auVar106);
        auVar106 = vmulps_avx512vl(local_140,auVar106);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar115,local_480);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar115,local_4a0);
        auVar115 = vfmadd231ps_avx512vl(auVar106,local_120,auVar115);
        auVar94 = vfmadd231ps_fma(auVar105,auVar116,local_3a0);
        auVar213 = ZEXT3264(local_3c0);
        auVar105 = vfmadd231ps_avx512vl(auVar107,auVar116,local_3c0);
        auVar106 = vfmadd231ps_avx512vl(auVar115,local_180,auVar116);
        auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar103,local_360);
        auVar111 = vfmadd231ps_avx512vl(auVar105,auVar103,local_380);
        auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x1210);
        auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x1b18);
        auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x1f9c);
        auVar106 = vfmadd231ps_avx512vl(auVar106,local_160,auVar103);
        auVar103 = vmulps_avx512vl(local_4c0,auVar115);
        auVar112 = vmulps_avx512vl(local_4e0,auVar115);
        auVar115 = vmulps_avx512vl(local_140,auVar115);
        auVar113 = vfmadd231ps_avx512vl(auVar103,auVar116,local_480);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar116,local_4a0);
        auVar116 = vfmadd231ps_avx512vl(auVar115,local_120,auVar116);
        auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x1694);
        auVar115 = vfmadd231ps_avx512vl(auVar113,auVar103,local_3a0);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar103,local_3c0);
        auVar103 = vfmadd231ps_avx512vl(auVar116,local_180,auVar103);
        auVar116 = vfmadd231ps_avx512vl(auVar115,auVar105,local_360);
        auVar115 = vfmadd231ps_avx512vl(auVar112,auVar105,local_380);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_160,auVar105);
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar107,auVar112);
        vandps_avx512vl(auVar111,auVar112);
        auVar105 = vmaxps_avx(auVar112,auVar112);
        vandps_avx512vl(auVar106,auVar112);
        auVar105 = vmaxps_avx(auVar105,auVar112);
        auVar106 = vbroadcastss_avx512vl(auVar96);
        uVar81 = vcmpps_avx512vl(auVar105,auVar106,1);
        bVar16 = (bool)((byte)uVar81 & 1);
        auVar117._0_4_ = (float)((uint)bVar16 * auVar102._0_4_ | (uint)!bVar16 * auVar107._0_4_);
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar16 * auVar102._4_4_ | (uint)!bVar16 * auVar107._4_4_);
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar16 * auVar102._8_4_ | (uint)!bVar16 * auVar107._8_4_);
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar16 * auVar102._12_4_ | (uint)!bVar16 * auVar107._12_4_);
        bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar16 * auVar102._16_4_ | (uint)!bVar16 * auVar107._16_4_);
        bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar16 * auVar102._20_4_ | (uint)!bVar16 * auVar107._20_4_);
        bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar16 * auVar102._24_4_ | (uint)!bVar16 * auVar107._24_4_);
        bVar16 = SUB81(uVar81 >> 7,0);
        auVar117._28_4_ = (uint)bVar16 * auVar102._28_4_ | (uint)!bVar16 * auVar107._28_4_;
        bVar16 = (bool)((byte)uVar81 & 1);
        auVar118._0_4_ = (float)((uint)bVar16 * auVar110._0_4_ | (uint)!bVar16 * auVar111._0_4_);
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar16 * auVar110._4_4_ | (uint)!bVar16 * auVar111._4_4_);
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar16 * auVar110._8_4_ | (uint)!bVar16 * auVar111._8_4_);
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar16 * auVar110._12_4_ | (uint)!bVar16 * auVar111._12_4_);
        bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar16 * auVar110._16_4_ | (uint)!bVar16 * auVar111._16_4_);
        bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar16 * auVar110._20_4_ | (uint)!bVar16 * auVar111._20_4_);
        bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar16 * auVar110._24_4_ | (uint)!bVar16 * auVar111._24_4_);
        bVar16 = SUB81(uVar81 >> 7,0);
        auVar118._28_4_ = (uint)bVar16 * auVar110._28_4_ | (uint)!bVar16 * auVar111._28_4_;
        vandps_avx512vl(auVar116,auVar112);
        vandps_avx512vl(auVar115,auVar112);
        auVar105 = vmaxps_avx(auVar118,auVar118);
        vandps_avx512vl(auVar103,auVar112);
        auVar105 = vmaxps_avx(auVar105,auVar118);
        uVar81 = vcmpps_avx512vl(auVar105,auVar106,1);
        bVar16 = (bool)((byte)uVar81 & 1);
        auVar119._0_4_ = (float)((uint)bVar16 * auVar102._0_4_ | (uint)!bVar16 * auVar116._0_4_);
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar16 * auVar102._4_4_ | (uint)!bVar16 * auVar116._4_4_);
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar16 * auVar102._8_4_ | (uint)!bVar16 * auVar116._8_4_);
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar16 * auVar102._12_4_ | (uint)!bVar16 * auVar116._12_4_);
        bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar16 * auVar102._16_4_ | (uint)!bVar16 * auVar116._16_4_);
        bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar16 * auVar102._20_4_ | (uint)!bVar16 * auVar116._20_4_);
        bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar16 * auVar102._24_4_ | (uint)!bVar16 * auVar116._24_4_);
        bVar16 = SUB81(uVar81 >> 7,0);
        auVar119._28_4_ = (uint)bVar16 * auVar102._28_4_ | (uint)!bVar16 * auVar116._28_4_;
        bVar16 = (bool)((byte)uVar81 & 1);
        auVar120._0_4_ = (float)((uint)bVar16 * auVar110._0_4_ | (uint)!bVar16 * auVar115._0_4_);
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar16 * auVar110._4_4_ | (uint)!bVar16 * auVar115._4_4_);
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar16 * auVar110._8_4_ | (uint)!bVar16 * auVar115._8_4_);
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar16 * auVar110._12_4_ | (uint)!bVar16 * auVar115._12_4_);
        bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar120._16_4_ = (float)((uint)bVar16 * auVar110._16_4_ | (uint)!bVar16 * auVar115._16_4_);
        bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar120._20_4_ = (float)((uint)bVar16 * auVar110._20_4_ | (uint)!bVar16 * auVar115._20_4_);
        bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar120._24_4_ = (float)((uint)bVar16 * auVar110._24_4_ | (uint)!bVar16 * auVar115._24_4_);
        bVar16 = SUB81(uVar81 >> 7,0);
        auVar120._28_4_ = (uint)bVar16 * auVar110._28_4_ | (uint)!bVar16 * auVar115._28_4_;
        auVar99 = vxorps_avx512vl(local_160._0_16_,local_160._0_16_);
        auVar205 = ZEXT1664(auVar99);
        auVar105 = vfmadd213ps_avx512vl(auVar117,auVar117,ZEXT1632(auVar99));
        auVar96 = vfmadd231ps_fma(auVar105,auVar118,auVar118);
        auVar105 = vrsqrt14ps_avx512vl(ZEXT1632(auVar96));
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0xbf000000));
        auVar115 = vmulps_avx512vl(ZEXT1632(auVar96),auVar116);
        fVar167 = auVar105._0_4_;
        fVar147 = auVar105._4_4_;
        fVar181 = auVar105._8_4_;
        fVar182 = auVar105._12_4_;
        fVar183 = auVar105._16_4_;
        fVar174 = auVar105._20_4_;
        fVar175 = auVar105._24_4_;
        auVar37._4_4_ = fVar147 * fVar147 * fVar147 * auVar115._4_4_;
        auVar37._0_4_ = fVar167 * fVar167 * fVar167 * auVar115._0_4_;
        auVar37._8_4_ = fVar181 * fVar181 * fVar181 * auVar115._8_4_;
        auVar37._12_4_ = fVar182 * fVar182 * fVar182 * auVar115._12_4_;
        auVar37._16_4_ = fVar183 * fVar183 * fVar183 * auVar115._16_4_;
        auVar37._20_4_ = fVar174 * fVar174 * fVar174 * auVar115._20_4_;
        auVar37._24_4_ = fVar175 * fVar175 * fVar175 * auVar115._24_4_;
        auVar37._28_4_ = auVar103._28_4_;
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar105 = vfmadd231ps_avx512vl(auVar37,auVar103,auVar105);
        auVar38._4_4_ = auVar118._4_4_ * auVar105._4_4_;
        auVar38._0_4_ = auVar118._0_4_ * auVar105._0_4_;
        auVar38._8_4_ = auVar118._8_4_ * auVar105._8_4_;
        auVar38._12_4_ = auVar118._12_4_ * auVar105._12_4_;
        auVar38._16_4_ = auVar118._16_4_ * auVar105._16_4_;
        auVar38._20_4_ = auVar118._20_4_ * auVar105._20_4_;
        auVar38._24_4_ = auVar118._24_4_ * auVar105._24_4_;
        auVar38._28_4_ = auVar115._28_4_;
        auVar39._4_4_ = auVar105._4_4_ * -auVar117._4_4_;
        auVar39._0_4_ = auVar105._0_4_ * -auVar117._0_4_;
        auVar39._8_4_ = auVar105._8_4_ * -auVar117._8_4_;
        auVar39._12_4_ = auVar105._12_4_ * -auVar117._12_4_;
        auVar39._16_4_ = auVar105._16_4_ * -auVar117._16_4_;
        auVar39._20_4_ = auVar105._20_4_ * -auVar117._20_4_;
        auVar39._24_4_ = auVar105._24_4_ * -auVar117._24_4_;
        auVar39._28_4_ = auVar118._28_4_;
        auVar115 = vmulps_avx512vl(auVar105,ZEXT1632(auVar99));
        auVar107 = ZEXT1632(auVar99);
        auVar106 = vfmadd213ps_avx512vl(auVar119,auVar119,auVar107);
        auVar96 = vfmadd231ps_fma(auVar106,auVar120,auVar120);
        auVar106 = vrsqrt14ps_avx512vl(ZEXT1632(auVar96));
        auVar116 = vmulps_avx512vl(ZEXT1632(auVar96),auVar116);
        fVar167 = auVar106._0_4_;
        fVar147 = auVar106._4_4_;
        fVar181 = auVar106._8_4_;
        fVar182 = auVar106._12_4_;
        fVar183 = auVar106._16_4_;
        fVar174 = auVar106._20_4_;
        fVar175 = auVar106._24_4_;
        auVar40._4_4_ = fVar147 * fVar147 * fVar147 * auVar116._4_4_;
        auVar40._0_4_ = fVar167 * fVar167 * fVar167 * auVar116._0_4_;
        auVar40._8_4_ = fVar181 * fVar181 * fVar181 * auVar116._8_4_;
        auVar40._12_4_ = fVar182 * fVar182 * fVar182 * auVar116._12_4_;
        auVar40._16_4_ = fVar183 * fVar183 * fVar183 * auVar116._16_4_;
        auVar40._20_4_ = fVar174 * fVar174 * fVar174 * auVar116._20_4_;
        auVar40._24_4_ = fVar175 * fVar175 * fVar175 * auVar116._24_4_;
        auVar40._28_4_ = auVar105._28_4_;
        auVar105 = vfmadd231ps_avx512vl(auVar40,auVar103,auVar106);
        auVar41._4_4_ = auVar120._4_4_ * auVar105._4_4_;
        auVar41._0_4_ = auVar120._0_4_ * auVar105._0_4_;
        auVar41._8_4_ = auVar120._8_4_ * auVar105._8_4_;
        auVar41._12_4_ = auVar120._12_4_ * auVar105._12_4_;
        auVar41._16_4_ = auVar120._16_4_ * auVar105._16_4_;
        auVar41._20_4_ = auVar120._20_4_ * auVar105._20_4_;
        auVar41._24_4_ = auVar120._24_4_ * auVar105._24_4_;
        auVar41._28_4_ = auVar116._28_4_;
        auVar42._4_4_ = auVar105._4_4_ * -auVar119._4_4_;
        auVar42._0_4_ = auVar105._0_4_ * -auVar119._0_4_;
        auVar42._8_4_ = auVar105._8_4_ * -auVar119._8_4_;
        auVar42._12_4_ = auVar105._12_4_ * -auVar119._12_4_;
        auVar42._16_4_ = auVar105._16_4_ * -auVar119._16_4_;
        auVar42._20_4_ = auVar105._20_4_ * -auVar119._20_4_;
        auVar42._24_4_ = auVar105._24_4_ * -auVar119._24_4_;
        auVar42._28_4_ = auVar106._28_4_;
        auVar105 = vmulps_avx512vl(auVar105,auVar107);
        auVar96 = vfmadd213ps_fma(auVar38,auVar100,ZEXT1632(auVar9));
        auVar94 = vfmadd213ps_fma(auVar39,auVar100,auVar108);
        auVar116 = vfmadd213ps_avx512vl(auVar115,auVar100,auVar114);
        auVar106 = vfmadd213ps_avx512vl(auVar41,auVar101,ZEXT1632(auVar10));
        auVar97 = vfnmadd213ps_fma(auVar38,auVar100,ZEXT1632(auVar9));
        auVar204 = vfmadd213ps_fma(auVar42,auVar101,auVar109);
        auVar98 = vfnmadd213ps_fma(auVar39,auVar100,auVar108);
        auVar6 = vfmadd213ps_fma(auVar105,auVar101,auVar104);
        auVar198 = vfnmadd231ps_fma(auVar114,auVar100,auVar115);
        auVar10 = vfnmadd213ps_fma(auVar41,auVar101,ZEXT1632(auVar10));
        auVar197 = vfnmadd213ps_fma(auVar42,auVar101,auVar109);
        auVar199 = vfnmadd231ps_fma(auVar104,auVar101,auVar105);
        auVar104 = vsubps_avx512vl(auVar106,ZEXT1632(auVar97));
        auVar105 = vsubps_avx(ZEXT1632(auVar204),ZEXT1632(auVar98));
        auVar103 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar198));
        auVar43._4_4_ = auVar105._4_4_ * auVar198._4_4_;
        auVar43._0_4_ = auVar105._0_4_ * auVar198._0_4_;
        auVar43._8_4_ = auVar105._8_4_ * auVar198._8_4_;
        auVar43._12_4_ = auVar105._12_4_ * auVar198._12_4_;
        auVar43._16_4_ = auVar105._16_4_ * 0.0;
        auVar43._20_4_ = auVar105._20_4_ * 0.0;
        auVar43._24_4_ = auVar105._24_4_ * 0.0;
        auVar43._28_4_ = auVar115._28_4_;
        auVar7 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar98),auVar103);
        auVar44._4_4_ = auVar103._4_4_ * auVar97._4_4_;
        auVar44._0_4_ = auVar103._0_4_ * auVar97._0_4_;
        auVar44._8_4_ = auVar103._8_4_ * auVar97._8_4_;
        auVar44._12_4_ = auVar103._12_4_ * auVar97._12_4_;
        auVar44._16_4_ = auVar103._16_4_ * 0.0;
        auVar44._20_4_ = auVar103._20_4_ * 0.0;
        auVar44._24_4_ = auVar103._24_4_ * 0.0;
        auVar44._28_4_ = auVar103._28_4_;
        auVar8 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar198),auVar104);
        auVar45._4_4_ = auVar98._4_4_ * auVar104._4_4_;
        auVar45._0_4_ = auVar98._0_4_ * auVar104._0_4_;
        auVar45._8_4_ = auVar98._8_4_ * auVar104._8_4_;
        auVar45._12_4_ = auVar98._12_4_ * auVar104._12_4_;
        auVar45._16_4_ = auVar104._16_4_ * 0.0;
        auVar45._20_4_ = auVar104._20_4_ * 0.0;
        auVar45._24_4_ = auVar104._24_4_ * 0.0;
        auVar45._28_4_ = auVar104._28_4_;
        auVar9 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar97),auVar105);
        auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar107,ZEXT1632(auVar8));
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,ZEXT1632(auVar7));
        auVar110 = ZEXT1632(auVar99);
        uVar81 = vcmpps_avx512vl(auVar105,auVar110,2);
        bVar15 = (byte)uVar81;
        fVar92 = (float)((uint)(bVar15 & 1) * auVar96._0_4_ |
                        (uint)!(bool)(bVar15 & 1) * auVar10._0_4_);
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        fVar141 = (float)((uint)bVar16 * auVar96._4_4_ | (uint)!bVar16 * auVar10._4_4_);
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        fVar143 = (float)((uint)bVar16 * auVar96._8_4_ | (uint)!bVar16 * auVar10._8_4_);
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        fVar145 = (float)((uint)bVar16 * auVar96._12_4_ | (uint)!bVar16 * auVar10._12_4_);
        auVar114 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar143,CONCAT44(fVar141,fVar92))));
        fVar93 = (float)((uint)(bVar15 & 1) * auVar94._0_4_ |
                        (uint)!(bool)(bVar15 & 1) * auVar197._0_4_);
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        fVar142 = (float)((uint)bVar16 * auVar94._4_4_ | (uint)!bVar16 * auVar197._4_4_);
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        fVar144 = (float)((uint)bVar16 * auVar94._8_4_ | (uint)!bVar16 * auVar197._8_4_);
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        fVar146 = (float)((uint)bVar16 * auVar94._12_4_ | (uint)!bVar16 * auVar197._12_4_);
        auVar107 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar144,CONCAT44(fVar142,fVar93))));
        auVar121._0_4_ =
             (float)((uint)(bVar15 & 1) * auVar116._0_4_ |
                    (uint)!(bool)(bVar15 & 1) * auVar199._0_4_);
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar16 * auVar116._4_4_ | (uint)!bVar16 * auVar199._4_4_);
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar16 * auVar116._8_4_ | (uint)!bVar16 * auVar199._8_4_);
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar16 * auVar116._12_4_ | (uint)!bVar16 * auVar199._12_4_);
        fVar167 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar116._16_4_);
        auVar121._16_4_ = fVar167;
        fVar147 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar116._20_4_);
        auVar121._20_4_ = fVar147;
        fVar181 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar116._24_4_);
        auVar121._24_4_ = fVar181;
        iVar1 = (uint)(byte)(uVar81 >> 7) * auVar116._28_4_;
        auVar121._28_4_ = iVar1;
        auVar105 = vblendmps_avx512vl(ZEXT1632(auVar97),auVar106);
        auVar122._0_4_ =
             (uint)(bVar15 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar96._0_4_;
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar122._4_4_ = (uint)bVar16 * auVar105._4_4_ | (uint)!bVar16 * auVar96._4_4_;
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar122._8_4_ = (uint)bVar16 * auVar105._8_4_ | (uint)!bVar16 * auVar96._8_4_;
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar122._12_4_ = (uint)bVar16 * auVar105._12_4_ | (uint)!bVar16 * auVar96._12_4_;
        auVar122._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * auVar105._16_4_;
        auVar122._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * auVar105._20_4_;
        auVar122._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * auVar105._24_4_;
        auVar122._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar105._28_4_;
        auVar105 = vblendmps_avx512vl(ZEXT1632(auVar98),ZEXT1632(auVar204));
        auVar123._0_4_ =
             (float)((uint)(bVar15 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar7._0_4_)
        ;
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar16 * auVar105._4_4_ | (uint)!bVar16 * auVar7._4_4_);
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar16 * auVar105._8_4_ | (uint)!bVar16 * auVar7._8_4_);
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar16 * auVar105._12_4_ | (uint)!bVar16 * auVar7._12_4_);
        fVar182 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar105._16_4_);
        auVar123._16_4_ = fVar182;
        fVar183 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar105._20_4_);
        auVar123._20_4_ = fVar183;
        fVar174 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar105._24_4_);
        auVar123._24_4_ = fVar174;
        auVar123._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar105._28_4_;
        auVar105 = vblendmps_avx512vl(ZEXT1632(auVar198),ZEXT1632(auVar6));
        auVar124._0_4_ =
             (float)((uint)(bVar15 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar94._0_4_
                    );
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar124._4_4_ = (float)((uint)bVar16 * auVar105._4_4_ | (uint)!bVar16 * auVar94._4_4_);
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar124._8_4_ = (float)((uint)bVar16 * auVar105._8_4_ | (uint)!bVar16 * auVar94._8_4_);
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar124._12_4_ = (float)((uint)bVar16 * auVar105._12_4_ | (uint)!bVar16 * auVar94._12_4_);
        fVar175 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar105._16_4_);
        auVar124._16_4_ = fVar175;
        fVar176 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar105._20_4_);
        auVar124._20_4_ = fVar176;
        fVar166 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar105._24_4_);
        auVar124._24_4_ = fVar166;
        iVar2 = (uint)(byte)(uVar81 >> 7) * auVar105._28_4_;
        auVar124._28_4_ = iVar2;
        auVar125._0_4_ =
             (uint)(bVar15 & 1) * (int)auVar97._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar106._0_4_;
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar16 * (int)auVar97._4_4_ | (uint)!bVar16 * auVar106._4_4_;
        bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar16 * (int)auVar97._8_4_ | (uint)!bVar16 * auVar106._8_4_;
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar16 * (int)auVar97._12_4_ | (uint)!bVar16 * auVar106._12_4_;
        auVar125._16_4_ = (uint)!(bool)((byte)(uVar81 >> 4) & 1) * auVar106._16_4_;
        auVar125._20_4_ = (uint)!(bool)((byte)(uVar81 >> 5) & 1) * auVar106._20_4_;
        auVar125._24_4_ = (uint)!(bool)((byte)(uVar81 >> 6) & 1) * auVar106._24_4_;
        auVar125._28_4_ = (uint)!SUB81(uVar81 >> 7,0) * auVar106._28_4_;
        bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
        bVar17 = (bool)((byte)(uVar81 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar81 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar108 = vsubps_avx512vl(auVar125,auVar114);
        auVar103 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar98._12_4_ |
                                                 (uint)!bVar20 * auVar204._12_4_,
                                                 CONCAT48((uint)bVar18 * (int)auVar98._8_4_ |
                                                          (uint)!bVar18 * auVar204._8_4_,
                                                          CONCAT44((uint)bVar16 * (int)auVar98._4_4_
                                                                   | (uint)!bVar16 * auVar204._4_4_,
                                                                   (uint)(bVar15 & 1) *
                                                                   (int)auVar98._0_4_ |
                                                                   (uint)!(bool)(bVar15 & 1) *
                                                                   auVar204._0_4_)))),auVar107);
        auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar198._12_4_ |
                                                 (uint)!bVar21 * auVar6._12_4_,
                                                 CONCAT48((uint)bVar19 * (int)auVar198._8_4_ |
                                                          (uint)!bVar19 * auVar6._8_4_,
                                                          CONCAT44((uint)bVar17 *
                                                                   (int)auVar198._4_4_ |
                                                                   (uint)!bVar17 * auVar6._4_4_,
                                                                   (uint)(bVar15 & 1) *
                                                                   (int)auVar198._0_4_ |
                                                                   (uint)!(bool)(bVar15 & 1) *
                                                                   auVar6._0_4_)))),auVar121);
        auVar115 = vsubps_avx(auVar114,auVar122);
        auVar106 = vsubps_avx(auVar107,auVar123);
        auVar104 = vsubps_avx(auVar121,auVar124);
        auVar46._4_4_ = auVar116._4_4_ * fVar141;
        auVar46._0_4_ = auVar116._0_4_ * fVar92;
        auVar46._8_4_ = auVar116._8_4_ * fVar143;
        auVar46._12_4_ = auVar116._12_4_ * fVar145;
        auVar46._16_4_ = auVar116._16_4_ * 0.0;
        auVar46._20_4_ = auVar116._20_4_ * 0.0;
        auVar46._24_4_ = auVar116._24_4_ * 0.0;
        auVar46._28_4_ = 0;
        auVar96 = vfmsub231ps_fma(auVar46,auVar121,auVar108);
        auVar172._0_4_ = fVar93 * auVar108._0_4_;
        auVar172._4_4_ = fVar142 * auVar108._4_4_;
        auVar172._8_4_ = fVar144 * auVar108._8_4_;
        auVar172._12_4_ = fVar146 * auVar108._12_4_;
        auVar172._16_4_ = auVar108._16_4_ * 0.0;
        auVar172._20_4_ = auVar108._20_4_ * 0.0;
        auVar172._24_4_ = auVar108._24_4_ * 0.0;
        auVar172._28_4_ = 0;
        auVar94 = vfmsub231ps_fma(auVar172,auVar114,auVar103);
        auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar110,ZEXT1632(auVar96));
        auVar177._0_4_ = auVar103._0_4_ * auVar121._0_4_;
        auVar177._4_4_ = auVar103._4_4_ * auVar121._4_4_;
        auVar177._8_4_ = auVar103._8_4_ * auVar121._8_4_;
        auVar177._12_4_ = auVar103._12_4_ * auVar121._12_4_;
        auVar177._16_4_ = auVar103._16_4_ * fVar167;
        auVar177._20_4_ = auVar103._20_4_ * fVar147;
        auVar177._24_4_ = auVar103._24_4_ * fVar181;
        auVar177._28_4_ = 0;
        auVar96 = vfmsub231ps_fma(auVar177,auVar107,auVar116);
        auVar109 = vfmadd231ps_avx512vl(auVar105,auVar110,ZEXT1632(auVar96));
        auVar105 = vmulps_avx512vl(auVar104,auVar122);
        auVar105 = vfmsub231ps_avx512vl(auVar105,auVar115,auVar124);
        auVar47._4_4_ = auVar106._4_4_ * auVar124._4_4_;
        auVar47._0_4_ = auVar106._0_4_ * auVar124._0_4_;
        auVar47._8_4_ = auVar106._8_4_ * auVar124._8_4_;
        auVar47._12_4_ = auVar106._12_4_ * auVar124._12_4_;
        auVar47._16_4_ = auVar106._16_4_ * fVar175;
        auVar47._20_4_ = auVar106._20_4_ * fVar176;
        auVar47._24_4_ = auVar106._24_4_ * fVar166;
        auVar47._28_4_ = iVar2;
        auVar96 = vfmsub231ps_fma(auVar47,auVar123,auVar104);
        auVar178._0_4_ = auVar123._0_4_ * auVar115._0_4_;
        auVar178._4_4_ = auVar123._4_4_ * auVar115._4_4_;
        auVar178._8_4_ = auVar123._8_4_ * auVar115._8_4_;
        auVar178._12_4_ = auVar123._12_4_ * auVar115._12_4_;
        auVar178._16_4_ = fVar182 * auVar115._16_4_;
        auVar178._20_4_ = fVar183 * auVar115._20_4_;
        auVar178._24_4_ = fVar174 * auVar115._24_4_;
        auVar178._28_4_ = 0;
        auVar94 = vfmsub231ps_fma(auVar178,auVar106,auVar122);
        auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar110,auVar105);
        auVar102 = vfmadd231ps_avx512vl(auVar105,auVar110,ZEXT1632(auVar96));
        auVar105 = vmaxps_avx(auVar109,auVar102);
        uVar23 = vcmpps_avx512vl(auVar105,auVar110,2);
        bVar91 = bVar91 & (byte)uVar23;
        auVar206 = ZEXT3264(local_360);
        auVar207 = ZEXT3264(local_380);
        auVar208 = ZEXT3264(local_3a0);
        if (bVar91 == 0) {
          bVar91 = 0;
        }
        else {
          auVar48._4_4_ = auVar104._4_4_ * auVar103._4_4_;
          auVar48._0_4_ = auVar104._0_4_ * auVar103._0_4_;
          auVar48._8_4_ = auVar104._8_4_ * auVar103._8_4_;
          auVar48._12_4_ = auVar104._12_4_ * auVar103._12_4_;
          auVar48._16_4_ = auVar104._16_4_ * auVar103._16_4_;
          auVar48._20_4_ = auVar104._20_4_ * auVar103._20_4_;
          auVar48._24_4_ = auVar104._24_4_ * auVar103._24_4_;
          auVar48._28_4_ = auVar105._28_4_;
          auVar204 = vfmsub231ps_fma(auVar48,auVar106,auVar116);
          auVar49._4_4_ = auVar116._4_4_ * auVar115._4_4_;
          auVar49._0_4_ = auVar116._0_4_ * auVar115._0_4_;
          auVar49._8_4_ = auVar116._8_4_ * auVar115._8_4_;
          auVar49._12_4_ = auVar116._12_4_ * auVar115._12_4_;
          auVar49._16_4_ = auVar116._16_4_ * auVar115._16_4_;
          auVar49._20_4_ = auVar116._20_4_ * auVar115._20_4_;
          auVar49._24_4_ = auVar116._24_4_ * auVar115._24_4_;
          auVar49._28_4_ = auVar116._28_4_;
          auVar94 = vfmsub231ps_fma(auVar49,auVar108,auVar104);
          auVar50._4_4_ = auVar106._4_4_ * auVar108._4_4_;
          auVar50._0_4_ = auVar106._0_4_ * auVar108._0_4_;
          auVar50._8_4_ = auVar106._8_4_ * auVar108._8_4_;
          auVar50._12_4_ = auVar106._12_4_ * auVar108._12_4_;
          auVar50._16_4_ = auVar106._16_4_ * auVar108._16_4_;
          auVar50._20_4_ = auVar106._20_4_ * auVar108._20_4_;
          auVar50._24_4_ = auVar106._24_4_ * auVar108._24_4_;
          auVar50._28_4_ = auVar106._28_4_;
          auVar6 = vfmsub231ps_fma(auVar50,auVar115,auVar103);
          auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar94),ZEXT1632(auVar6));
          auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar204),auVar110);
          auVar103 = vrcp14ps_avx512vl(auVar105);
          auVar26._8_4_ = 0x3f800000;
          auVar26._0_8_ = &DAT_3f8000003f800000;
          auVar26._12_4_ = 0x3f800000;
          auVar26._16_4_ = 0x3f800000;
          auVar26._20_4_ = 0x3f800000;
          auVar26._24_4_ = 0x3f800000;
          auVar26._28_4_ = 0x3f800000;
          auVar116 = vfnmadd213ps_avx512vl(auVar103,auVar105,auVar26);
          auVar96 = vfmadd132ps_fma(auVar116,auVar103,auVar103);
          auVar51._4_4_ = auVar6._4_4_ * auVar121._4_4_;
          auVar51._0_4_ = auVar6._0_4_ * auVar121._0_4_;
          auVar51._8_4_ = auVar6._8_4_ * auVar121._8_4_;
          auVar51._12_4_ = auVar6._12_4_ * auVar121._12_4_;
          auVar51._16_4_ = fVar167 * 0.0;
          auVar51._20_4_ = fVar147 * 0.0;
          auVar51._24_4_ = fVar181 * 0.0;
          auVar51._28_4_ = iVar1;
          auVar94 = vfmadd231ps_fma(auVar51,auVar107,ZEXT1632(auVar94));
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar114,ZEXT1632(auVar204));
          fVar147 = auVar96._0_4_;
          fVar181 = auVar96._4_4_;
          fVar182 = auVar96._8_4_;
          fVar183 = auVar96._12_4_;
          auVar103 = ZEXT1632(CONCAT412(auVar94._12_4_ * fVar183,
                                        CONCAT48(auVar94._8_4_ * fVar182,
                                                 CONCAT44(auVar94._4_4_ * fVar181,
                                                          auVar94._0_4_ * fVar147))));
          auVar193._4_4_ = uVar148;
          auVar193._0_4_ = uVar148;
          auVar193._8_4_ = uVar148;
          auVar193._12_4_ = uVar148;
          auVar193._16_4_ = uVar148;
          auVar193._20_4_ = uVar148;
          auVar193._24_4_ = uVar148;
          auVar193._28_4_ = uVar148;
          uVar23 = vcmpps_avx512vl(auVar193,auVar103,2);
          fVar167 = (ray->super_RayK<1>).tfar;
          auVar27._4_4_ = fVar167;
          auVar27._0_4_ = fVar167;
          auVar27._8_4_ = fVar167;
          auVar27._12_4_ = fVar167;
          auVar27._16_4_ = fVar167;
          auVar27._20_4_ = fVar167;
          auVar27._24_4_ = fVar167;
          auVar27._28_4_ = fVar167;
          uVar24 = vcmpps_avx512vl(auVar103,auVar27,2);
          bVar91 = (byte)uVar23 & (byte)uVar24 & bVar91;
          if (bVar91 != 0) {
            uVar23 = vcmpps_avx512vl(auVar105,auVar110,4);
            if ((bVar91 & (byte)uVar23) != 0) {
              bVar91 = bVar91 & (byte)uVar23;
              fVar167 = auVar109._0_4_ * fVar147;
              fVar174 = auVar109._4_4_ * fVar181;
              auVar52._4_4_ = fVar174;
              auVar52._0_4_ = fVar167;
              fVar175 = auVar109._8_4_ * fVar182;
              auVar52._8_4_ = fVar175;
              fVar176 = auVar109._12_4_ * fVar183;
              auVar52._12_4_ = fVar176;
              fVar166 = auVar109._16_4_ * 0.0;
              auVar52._16_4_ = fVar166;
              fVar92 = auVar109._20_4_ * 0.0;
              auVar52._20_4_ = fVar92;
              fVar93 = auVar109._24_4_ * 0.0;
              auVar52._24_4_ = fVar93;
              auVar52._28_4_ = auVar109._28_4_;
              fVar147 = auVar102._0_4_ * fVar147;
              fVar181 = auVar102._4_4_ * fVar181;
              auVar53._4_4_ = fVar181;
              auVar53._0_4_ = fVar147;
              fVar182 = auVar102._8_4_ * fVar182;
              auVar53._8_4_ = fVar182;
              fVar183 = auVar102._12_4_ * fVar183;
              auVar53._12_4_ = fVar183;
              fVar141 = auVar102._16_4_ * 0.0;
              auVar53._16_4_ = fVar141;
              fVar142 = auVar102._20_4_ * 0.0;
              auVar53._20_4_ = fVar142;
              fVar143 = auVar102._24_4_ * 0.0;
              auVar53._24_4_ = fVar143;
              auVar53._28_4_ = auVar102._28_4_;
              auVar190._8_4_ = 0x3f800000;
              auVar190._0_8_ = &DAT_3f8000003f800000;
              auVar190._12_4_ = 0x3f800000;
              auVar190._16_4_ = 0x3f800000;
              auVar190._20_4_ = 0x3f800000;
              auVar190._24_4_ = 0x3f800000;
              auVar190._28_4_ = 0x3f800000;
              auVar105 = vsubps_avx(auVar190,auVar52);
              local_3e0._0_4_ =
                   (uint)(bVar15 & 1) * (int)fVar167 | (uint)!(bool)(bVar15 & 1) * auVar105._0_4_;
              bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
              local_3e0._4_4_ = (uint)bVar16 * (int)fVar174 | (uint)!bVar16 * auVar105._4_4_;
              bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
              local_3e0._8_4_ = (uint)bVar16 * (int)fVar175 | (uint)!bVar16 * auVar105._8_4_;
              bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
              local_3e0._12_4_ = (uint)bVar16 * (int)fVar176 | (uint)!bVar16 * auVar105._12_4_;
              bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
              local_3e0._16_4_ = (uint)bVar16 * (int)fVar166 | (uint)!bVar16 * auVar105._16_4_;
              bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
              local_3e0._20_4_ = (uint)bVar16 * (int)fVar92 | (uint)!bVar16 * auVar105._20_4_;
              bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
              local_3e0._24_4_ = (uint)bVar16 * (int)fVar93 | (uint)!bVar16 * auVar105._24_4_;
              bVar16 = SUB81(uVar81 >> 7,0);
              local_3e0._28_4_ = (uint)bVar16 * auVar109._28_4_ | (uint)!bVar16 * auVar105._28_4_;
              auVar105 = vsubps_avx(auVar190,auVar53);
              bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
              bVar17 = (bool)((byte)(uVar81 >> 2) & 1);
              bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
              bVar19 = (bool)((byte)(uVar81 >> 4) & 1);
              bVar20 = (bool)((byte)(uVar81 >> 5) & 1);
              bVar21 = (bool)((byte)(uVar81 >> 6) & 1);
              bVar22 = SUB81(uVar81 >> 7,0);
              local_1c0._4_4_ = (uint)bVar16 * (int)fVar181 | (uint)!bVar16 * auVar105._4_4_;
              local_1c0._0_4_ =
                   (uint)(bVar15 & 1) * (int)fVar147 | (uint)!(bool)(bVar15 & 1) * auVar105._0_4_;
              local_1c0._8_4_ = (uint)bVar17 * (int)fVar182 | (uint)!bVar17 * auVar105._8_4_;
              local_1c0._12_4_ = (uint)bVar18 * (int)fVar183 | (uint)!bVar18 * auVar105._12_4_;
              local_1c0._16_4_ = (uint)bVar19 * (int)fVar141 | (uint)!bVar19 * auVar105._16_4_;
              local_1c0._20_4_ = (uint)bVar20 * (int)fVar142 | (uint)!bVar20 * auVar105._20_4_;
              local_1c0._24_4_ = (uint)bVar21 * (int)fVar143 | (uint)!bVar21 * auVar105._24_4_;
              local_1c0._28_4_ = (uint)bVar22 * auVar102._28_4_ | (uint)!bVar22 * auVar105._28_4_;
              local_460 = auVar103;
              goto LAB_01d8475d;
            }
          }
          bVar91 = 0;
        }
LAB_01d8475d:
        auVar212 = ZEXT3264(local_4e0);
        auVar211 = ZEXT3264(local_4c0);
        auVar210 = ZEXT3264(local_4a0);
        auVar209 = ZEXT3264(local_480);
        local_5a0 = auVar11;
        if (bVar91 != 0) {
          auVar105 = vsubps_avx(auVar101,auVar100);
          auVar96 = vfmadd213ps_fma(auVar105,local_3e0,auVar100);
          fVar167 = pre->depth_scale;
          auVar28._4_4_ = fVar167;
          auVar28._0_4_ = fVar167;
          auVar28._8_4_ = fVar167;
          auVar28._12_4_ = fVar167;
          auVar28._16_4_ = fVar167;
          auVar28._20_4_ = fVar167;
          auVar28._24_4_ = fVar167;
          auVar28._28_4_ = fVar167;
          auVar105 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar96._12_4_ + auVar96._12_4_,
                                                        CONCAT48(auVar96._8_4_ + auVar96._8_4_,
                                                                 CONCAT44(auVar96._4_4_ +
                                                                          auVar96._4_4_,
                                                                          auVar96._0_4_ +
                                                                          auVar96._0_4_)))),auVar28)
          ;
          uVar23 = vcmpps_avx512vl(local_460,auVar105,6);
          bVar91 = bVar91 & (byte)uVar23;
          if (bVar91 != 0) {
            auVar151._8_4_ = 0xbf800000;
            auVar151._0_8_ = 0xbf800000bf800000;
            auVar151._12_4_ = 0xbf800000;
            auVar151._16_4_ = 0xbf800000;
            auVar151._20_4_ = 0xbf800000;
            auVar151._24_4_ = 0xbf800000;
            auVar151._28_4_ = 0xbf800000;
            auVar29._8_4_ = 0x40000000;
            auVar29._0_8_ = 0x4000000040000000;
            auVar29._12_4_ = 0x40000000;
            auVar29._16_4_ = 0x40000000;
            auVar29._20_4_ = 0x40000000;
            auVar29._24_4_ = 0x40000000;
            auVar29._28_4_ = 0x40000000;
            local_1c0 = vfmadd132ps_avx512vl(local_1c0,auVar151,auVar29);
            local_320 = local_3e0;
            auVar105 = local_1c0;
            local_300 = local_1c0;
            local_2e0 = local_460;
            local_2c0 = 0;
            local_2bc = iVar13;
            local_2b0 = local_5a0._0_8_;
            uStack_2a8 = local_5a0._8_8_;
            local_2a0 = local_530._0_8_;
            uStack_298 = local_530._8_8_;
            local_290 = local_540._0_8_;
            uStack_288 = local_540._8_8_;
            local_280 = local_550;
            uStack_278 = uStack_548;
            local_270 = bVar91;
            local_1c0 = auVar105;
            if ((pGVar89->mask & (ray->super_RayK<1>).mask) != 0) {
              fVar167 = 1.0 / auVar195._0_4_;
              local_260[0] = fVar167 * (local_3e0._0_4_ + 0.0);
              local_260[1] = fVar167 * (local_3e0._4_4_ + 1.0);
              local_260[2] = fVar167 * (local_3e0._8_4_ + 2.0);
              local_260[3] = fVar167 * (local_3e0._12_4_ + 3.0);
              fStack_250 = fVar167 * (local_3e0._16_4_ + 4.0);
              fStack_24c = fVar167 * (local_3e0._20_4_ + 5.0);
              fStack_248 = fVar167 * (local_3e0._24_4_ + 6.0);
              fStack_244 = local_3e0._28_4_ + 7.0;
              local_240 = local_1c0._0_8_;
              uStack_238 = local_1c0._8_8_;
              uStack_230 = local_1c0._16_8_;
              uStack_228 = local_1c0._24_8_;
              local_220 = local_460;
              auVar152._8_4_ = 0x7f800000;
              auVar152._0_8_ = 0x7f8000007f800000;
              auVar152._12_4_ = 0x7f800000;
              auVar152._16_4_ = 0x7f800000;
              auVar152._20_4_ = 0x7f800000;
              auVar152._24_4_ = 0x7f800000;
              auVar152._28_4_ = 0x7f800000;
              auVar103 = vblendmps_avx512vl(auVar152,local_460);
              auVar126._0_4_ =
                   (uint)(bVar91 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar91 & 1) * 0x7f800000;
              bVar16 = (bool)(bVar91 >> 1 & 1);
              auVar126._4_4_ = (uint)bVar16 * auVar103._4_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar91 >> 2 & 1);
              auVar126._8_4_ = (uint)bVar16 * auVar103._8_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar91 >> 3 & 1);
              auVar126._12_4_ = (uint)bVar16 * auVar103._12_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar91 >> 4 & 1);
              auVar126._16_4_ = (uint)bVar16 * auVar103._16_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar91 >> 5 & 1);
              auVar126._20_4_ = (uint)bVar16 * auVar103._20_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar91 >> 6 & 1);
              auVar126._24_4_ = (uint)bVar16 * auVar103._24_4_ | (uint)!bVar16 * 0x7f800000;
              auVar126._28_4_ =
                   (uint)(bVar91 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar91 >> 7) * 0x7f800000;
              auVar103 = vshufps_avx(auVar126,auVar126,0xb1);
              auVar103 = vminps_avx(auVar126,auVar103);
              auVar116 = vshufpd_avx(auVar103,auVar103,5);
              auVar103 = vminps_avx(auVar103,auVar116);
              auVar116 = vpermpd_avx2(auVar103,0x4e);
              auVar103 = vminps_avx(auVar103,auVar116);
              uVar23 = vcmpps_avx512vl(auVar126,auVar103,0);
              bVar80 = (byte)uVar23 & bVar91;
              bVar15 = bVar91;
              if (bVar80 != 0) {
                bVar15 = bVar80;
              }
              uVar25 = 0;
              for (uVar83 = (uint)bVar15; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
                uVar25 = uVar25 + 1;
              }
              uVar81 = (ulong)uVar25;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar89->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar167 = local_260[uVar81];
                fVar147 = *(float *)((long)&local_240 + uVar81 * 4);
                fVar182 = 1.0 - fVar167;
                fVar181 = fVar182 * fVar182 * -3.0;
                auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar182 * fVar182)),
                                          ZEXT416((uint)(fVar167 * fVar182)),ZEXT416(0xc0000000));
                auVar94 = vfmsub132ss_fma(ZEXT416((uint)(fVar167 * fVar182)),
                                          ZEXT416((uint)(fVar167 * fVar167)),ZEXT416(0x40000000));
                fVar182 = auVar96._0_4_ * 3.0;
                fVar183 = auVar94._0_4_ * 3.0;
                fVar174 = fVar167 * fVar167 * 3.0;
                auVar184._0_4_ = fVar174 * (float)local_550._0_4_;
                auVar184._4_4_ = fVar174 * (float)local_550._4_4_;
                auVar184._8_4_ = fVar174 * (float)uStack_548;
                auVar184._12_4_ = fVar174 * uStack_548._4_4_;
                auVar158._4_4_ = fVar183;
                auVar158._0_4_ = fVar183;
                auVar158._8_4_ = fVar183;
                auVar158._12_4_ = fVar183;
                auVar96 = vfmadd132ps_fma(auVar158,auVar184,local_540);
                auVar168._4_4_ = fVar182;
                auVar168._0_4_ = fVar182;
                auVar168._8_4_ = fVar182;
                auVar168._12_4_ = fVar182;
                auVar96 = vfmadd132ps_fma(auVar168,auVar96,local_530);
                auVar159._4_4_ = fVar181;
                auVar159._0_4_ = fVar181;
                auVar159._8_4_ = fVar181;
                auVar159._12_4_ = fVar181;
                (ray->super_RayK<1>).tfar = *(float *)(local_220 + uVar81 * 4);
                auVar96 = vfmadd132ps_fma(auVar159,auVar96,local_5a0);
                uVar23 = vmovlps_avx(auVar96);
                *(undefined8 *)&(ray->Ng).field_0 = uVar23;
                fVar181 = (float)vextractps_avx(auVar96,2);
                (ray->Ng).field_0.field_0.z = fVar181;
                ray->u = fVar167;
                ray->v = fVar147;
                ray->primID = uVar84;
                ray->geomID = uVar90;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_410 = local_530._0_8_;
                uStack_408 = local_530._8_8_;
                local_420 = local_540._0_8_;
                uStack_418 = local_540._8_8_;
                local_430 = local_550;
                uStack_428 = uStack_548;
                local_5f0 = prim;
                local_5f8 = pre;
                _local_550 = auVar149;
                local_540 = auVar95;
                local_530 = auVar157;
                do {
                  auVar204 = auVar205._0_16_;
                  local_584 = local_260[uVar81];
                  local_580 = *(undefined4 *)((long)&local_240 + uVar81 * 4);
                  fVar167 = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = *(float *)(local_220 + uVar81 * 4);
                  local_5d0.context = context->user;
                  fVar181 = 1.0 - local_584;
                  fVar147 = fVar181 * fVar181 * -3.0;
                  auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar181 * fVar181)),
                                            ZEXT416((uint)(local_584 * fVar181)),ZEXT416(0xc0000000)
                                           );
                  auVar94 = vfmsub132ss_fma(ZEXT416((uint)(local_584 * fVar181)),
                                            ZEXT416((uint)(local_584 * local_584)),
                                            ZEXT416(0x40000000));
                  fVar181 = auVar96._0_4_ * 3.0;
                  fVar182 = auVar94._0_4_ * 3.0;
                  fVar183 = local_584 * local_584 * 3.0;
                  auVar187._0_4_ = fVar183 * (float)local_430;
                  auVar187._4_4_ = fVar183 * local_430._4_4_;
                  auVar187._8_4_ = fVar183 * (float)uStack_428;
                  auVar187._12_4_ = fVar183 * uStack_428._4_4_;
                  auVar164._4_4_ = fVar182;
                  auVar164._0_4_ = fVar182;
                  auVar164._8_4_ = fVar182;
                  auVar164._12_4_ = fVar182;
                  auVar75._8_8_ = uStack_418;
                  auVar75._0_8_ = local_420;
                  auVar96 = vfmadd132ps_fma(auVar164,auVar187,auVar75);
                  auVar171._4_4_ = fVar181;
                  auVar171._0_4_ = fVar181;
                  auVar171._8_4_ = fVar181;
                  auVar171._12_4_ = fVar181;
                  auVar77._8_8_ = uStack_408;
                  auVar77._0_8_ = local_410;
                  auVar96 = vfmadd132ps_fma(auVar171,auVar96,auVar77);
                  auVar165._4_4_ = fVar147;
                  auVar165._0_4_ = fVar147;
                  auVar165._8_4_ = fVar147;
                  auVar165._12_4_ = fVar147;
                  auVar96 = vfmadd132ps_fma(auVar165,auVar96,local_5a0);
                  local_590 = vmovlps_avx(auVar96);
                  local_588 = vextractps_avx(auVar96,2);
                  local_57c = (int)local_5d8;
                  local_578 = (int)local_5e0;
                  local_574 = (local_5d0.context)->instID[0];
                  local_570 = (local_5d0.context)->instPrimID[0];
                  local_5fc = -1;
                  local_5d0.valid = &local_5fc;
                  local_5d0.geometryUserPtr = pGVar89->userPtr;
                  local_5d0.ray = (RTCRayN *)ray;
                  local_5d0.hit = (RTCHitN *)&local_590;
                  local_5d0.N = 1;
                  local_5e8 = uVar81;
                  if (pGVar89->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d859f2:
                    auVar96 = auVar205._0_16_;
                    p_Var14 = context->args->filter;
                    if (p_Var14 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar89->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var14)(&local_5d0);
                        auVar212 = ZEXT3264(local_4e0);
                        auVar211 = ZEXT3264(local_4c0);
                        auVar210 = ZEXT3264(local_4a0);
                        auVar209 = ZEXT3264(local_480);
                        auVar213 = ZEXT3264(local_3c0);
                        auVar208 = ZEXT3264(local_3a0);
                        auVar207 = ZEXT3264(local_380);
                        auVar206 = ZEXT3264(local_360);
                        auVar96 = vxorps_avx512vl(auVar96,auVar96);
                        auVar205 = ZEXT1664(auVar96);
                        prim = local_5f0;
                        pre = local_5f8;
                        uVar148 = local_400;
                      }
                      if (*local_5d0.valid == 0) goto LAB_01d85ae5;
                    }
                    (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_5d0.hit;
                    (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_5d0.hit + 4);
                    (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_5d0.hit + 8);
                    *(float *)((long)local_5d0.ray + 0x3c) = *(float *)(local_5d0.hit + 0xc);
                    *(float *)((long)local_5d0.ray + 0x40) = *(float *)(local_5d0.hit + 0x10);
                    *(float *)((long)local_5d0.ray + 0x44) = *(float *)(local_5d0.hit + 0x14);
                    *(float *)((long)local_5d0.ray + 0x48) = *(float *)(local_5d0.hit + 0x18);
                    *(float *)((long)local_5d0.ray + 0x4c) = *(float *)(local_5d0.hit + 0x1c);
                    *(float *)((long)local_5d0.ray + 0x50) = *(float *)(local_5d0.hit + 0x20);
                  }
                  else {
                    (*pGVar89->intersectionFilterN)(&local_5d0);
                    auVar212 = ZEXT3264(local_4e0);
                    auVar211 = ZEXT3264(local_4c0);
                    auVar210 = ZEXT3264(local_4a0);
                    auVar209 = ZEXT3264(local_480);
                    auVar213 = ZEXT3264(local_3c0);
                    auVar208 = ZEXT3264(local_3a0);
                    auVar207 = ZEXT3264(local_380);
                    auVar206 = ZEXT3264(local_360);
                    auVar96 = vxorps_avx512vl(auVar204,auVar204);
                    auVar205 = ZEXT1664(auVar96);
                    prim = local_5f0;
                    pre = local_5f8;
                    uVar148 = local_400;
                    if (*local_5d0.valid != 0) goto LAB_01d859f2;
LAB_01d85ae5:
                    (ray->super_RayK<1>).tfar = fVar167;
                  }
                  bVar15 = ~(byte)(1 << ((uint)local_5e8 & 0x1f)) & bVar91;
                  fVar167 = (ray->super_RayK<1>).tfar;
                  auVar36._4_4_ = fVar167;
                  auVar36._0_4_ = fVar167;
                  auVar36._8_4_ = fVar167;
                  auVar36._12_4_ = fVar167;
                  auVar36._16_4_ = fVar167;
                  auVar36._20_4_ = fVar167;
                  auVar36._24_4_ = fVar167;
                  auVar36._28_4_ = fVar167;
                  uVar23 = vcmpps_avx512vl(local_460,auVar36,2);
                  bVar91 = bVar15 & (byte)uVar23;
                  uVar81 = local_5e8;
                  if ((bVar15 & (byte)uVar23) != 0) {
                    auVar156._8_4_ = 0x7f800000;
                    auVar156._0_8_ = 0x7f8000007f800000;
                    auVar156._12_4_ = 0x7f800000;
                    auVar156._16_4_ = 0x7f800000;
                    auVar156._20_4_ = 0x7f800000;
                    auVar156._24_4_ = 0x7f800000;
                    auVar156._28_4_ = 0x7f800000;
                    auVar105 = vblendmps_avx512vl(auVar156,local_460);
                    auVar140._0_4_ =
                         (uint)(bVar91 & 1) * auVar105._0_4_ |
                         (uint)!(bool)(bVar91 & 1) * 0x7f800000;
                    bVar16 = (bool)(bVar91 >> 1 & 1);
                    auVar140._4_4_ = (uint)bVar16 * auVar105._4_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar91 >> 2 & 1);
                    auVar140._8_4_ = (uint)bVar16 * auVar105._8_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar91 >> 3 & 1);
                    auVar140._12_4_ = (uint)bVar16 * auVar105._12_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar91 >> 4 & 1);
                    auVar140._16_4_ = (uint)bVar16 * auVar105._16_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar91 >> 5 & 1);
                    auVar140._20_4_ = (uint)bVar16 * auVar105._20_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar91 >> 6 & 1);
                    auVar140._24_4_ = (uint)bVar16 * auVar105._24_4_ | (uint)!bVar16 * 0x7f800000;
                    auVar140._28_4_ =
                         (uint)(bVar91 >> 7) * auVar105._28_4_ |
                         (uint)!(bool)(bVar91 >> 7) * 0x7f800000;
                    auVar105 = vshufps_avx(auVar140,auVar140,0xb1);
                    auVar105 = vminps_avx(auVar140,auVar105);
                    auVar103 = vshufpd_avx(auVar105,auVar105,5);
                    auVar105 = vminps_avx(auVar105,auVar103);
                    auVar103 = vpermpd_avx2(auVar105,0x4e);
                    auVar105 = vminps_avx(auVar105,auVar103);
                    uVar23 = vcmpps_avx512vl(auVar140,auVar105,0);
                    bVar80 = (byte)uVar23 & bVar91;
                    bVar15 = bVar91;
                    if (bVar80 != 0) {
                      bVar15 = bVar80;
                    }
                    uVar90 = 0;
                    for (uVar84 = (uint)bVar15; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000
                        ) {
                      uVar90 = uVar90 + 1;
                    }
                    uVar81 = (ulong)uVar90;
                  }
                  auVar149 = _local_550;
                  auVar95 = local_540;
                  auVar157 = local_530;
                } while (bVar91 != 0);
              }
            }
          }
        }
      }
      local_530 = auVar157;
      local_540 = auVar95;
      _local_550 = auVar149;
      if (8 < iVar13) {
        auVar105 = vpbroadcastd_avx512vl();
        auVar214 = ZEXT3264(auVar105);
        local_400 = local_1e0;
        uStack_3fc = local_1e0;
        uStack_3f8 = local_1e0;
        uStack_3f4 = local_1e0;
        uStack_3f0 = local_1e0;
        uStack_3ec = local_1e0;
        uStack_3e8 = local_1e0;
        uStack_3e4 = local_1e0;
        local_1e0 = uVar148;
        uStack_1dc = uVar148;
        uStack_1d8 = uVar148;
        uStack_1d4 = uVar148;
        uStack_1d0 = uVar148;
        uStack_1cc = uVar148;
        uStack_1c8 = uVar148;
        uStack_1c4 = uVar148;
        local_340._4_4_ = 1.0 / (float)local_340._0_4_;
        local_340._0_4_ = local_340._4_4_;
        fStack_338 = (float)local_340._4_4_;
        fStack_334 = (float)local_340._4_4_;
        fStack_330 = (float)local_340._4_4_;
        fStack_32c = (float)local_340._4_4_;
        fStack_328 = (float)local_340._4_4_;
        fStack_324 = (float)local_340._4_4_;
        lVar87 = 8;
        do {
          auVar105 = vpbroadcastd_avx512vl();
          auVar106 = vpor_avx2(auVar105,_DAT_0205a920);
          uVar24 = vpcmpgtd_avx512vl(auVar214._0_32_,auVar106);
          auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar87 * 4 + lVar73);
          auVar103 = *(undefined1 (*) [32])(lVar73 + 0x2227768 + lVar87 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar73 + 0x2227bec + lVar87 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar73 + 0x2228070 + lVar87 * 4);
          local_4c0 = auVar211._0_32_;
          auVar104 = vmulps_avx512vl(local_4c0,auVar115);
          local_4e0 = auVar212._0_32_;
          auVar114 = vmulps_avx512vl(local_4e0,auVar115);
          auVar54._4_4_ = auVar115._4_4_ * (float)local_e0._4_4_;
          auVar54._0_4_ = auVar115._0_4_ * (float)local_e0._0_4_;
          auVar54._8_4_ = auVar115._8_4_ * fStack_d8;
          auVar54._12_4_ = auVar115._12_4_ * fStack_d4;
          auVar54._16_4_ = auVar115._16_4_ * fStack_d0;
          auVar54._20_4_ = auVar115._20_4_ * fStack_cc;
          auVar54._24_4_ = auVar115._24_4_ * fStack_c8;
          auVar54._28_4_ = auVar106._28_4_;
          local_480 = auVar209._0_32_;
          auVar106 = vfmadd231ps_avx512vl(auVar104,auVar116,local_480);
          local_4a0 = auVar210._0_32_;
          auVar104 = vfmadd231ps_avx512vl(auVar114,auVar116,local_4a0);
          auVar96 = vfmadd231ps_fma(auVar54,auVar116,local_c0);
          auVar192 = auVar208._0_32_;
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,auVar192);
          auVar200 = auVar213._0_32_;
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar200);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar103,local_a0);
          auVar188 = auVar206._0_32_;
          auVar102 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar188);
          auVar189 = auVar207._0_32_;
          auVar110 = vfmadd231ps_avx512vl(auVar104,auVar105,auVar189);
          auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 * 4 + lVar73);
          auVar104 = *(undefined1 (*) [32])(lVar73 + 0x2229b88 + lVar87 * 4);
          auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar105,local_100);
          auVar114 = *(undefined1 (*) [32])(lVar73 + 0x222a00c + lVar87 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar73 + 0x222a490 + lVar87 * 4);
          auVar108 = vmulps_avx512vl(local_4c0,auVar107);
          auVar109 = vmulps_avx512vl(local_4e0,auVar107);
          auVar55._4_4_ = auVar107._4_4_ * (float)local_e0._4_4_;
          auVar55._0_4_ = auVar107._0_4_ * (float)local_e0._0_4_;
          auVar55._8_4_ = auVar107._8_4_ * fStack_d8;
          auVar55._12_4_ = auVar107._12_4_ * fStack_d4;
          auVar55._16_4_ = auVar107._16_4_ * fStack_d0;
          auVar55._20_4_ = auVar107._20_4_ * fStack_cc;
          auVar55._24_4_ = auVar107._24_4_ * fStack_c8;
          auVar55._28_4_ = uStack_c4;
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar114,local_480);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar114,local_4a0);
          auVar96 = vfmadd231ps_fma(auVar55,auVar114,local_c0);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar104,auVar192);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar104,auVar200);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar104,local_a0);
          auVar100 = vfmadd231ps_avx512vl(auVar108,auVar106,auVar188);
          auVar101 = vfmadd231ps_avx512vl(auVar109,auVar106,auVar189);
          auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar106,local_100);
          auVar113 = vmaxps_avx512vl(auVar111,auVar112);
          auVar108 = vsubps_avx(auVar100,auVar102);
          auVar109 = vsubps_avx(auVar101,auVar110);
          auVar127 = vmulps_avx512vl(auVar110,auVar108);
          in_ZMM23 = ZEXT3264(auVar200);
          auVar128 = vmulps_avx512vl(auVar102,auVar109);
          auVar127 = vsubps_avx512vl(auVar127,auVar128);
          auVar128 = vmulps_avx512vl(auVar109,auVar109);
          auVar128 = vfmadd231ps_avx512vl(auVar128,auVar108,auVar108);
          auVar113 = vmulps_avx512vl(auVar113,auVar113);
          auVar113 = vmulps_avx512vl(auVar113,auVar128);
          auVar127 = vmulps_avx512vl(auVar127,auVar127);
          uVar23 = vcmpps_avx512vl(auVar127,auVar113,2);
          bVar91 = (byte)uVar24 & (byte)uVar23;
          if (bVar91 == 0) {
            auVar213 = ZEXT3264(auVar200);
          }
          else {
            auVar107 = vmulps_avx512vl(local_140,auVar107);
            auVar114 = vfmadd213ps_avx512vl(auVar114,local_120,auVar107);
            auVar104 = vfmadd213ps_avx512vl(auVar104,local_180,auVar114);
            auVar106 = vfmadd213ps_avx512vl(auVar106,local_160,auVar104);
            auVar115 = vmulps_avx512vl(local_140,auVar115);
            auVar116 = vfmadd213ps_avx512vl(auVar116,local_120,auVar115);
            auVar103 = vfmadd213ps_avx512vl(auVar103,local_180,auVar116);
            auVar104 = vfmadd213ps_avx512vl(auVar105,local_160,auVar103);
            auVar105 = *(undefined1 (*) [32])(lVar73 + 0x22284f4 + lVar87 * 4);
            auVar103 = *(undefined1 (*) [32])(lVar73 + 0x2228978 + lVar87 * 4);
            auVar116 = *(undefined1 (*) [32])(lVar73 + 0x2228dfc + lVar87 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar73 + 0x2229280 + lVar87 * 4);
            auVar114 = vmulps_avx512vl(local_4c0,auVar115);
            auVar107 = vmulps_avx512vl(local_4e0,auVar115);
            auVar115 = vmulps_avx512vl(local_140,auVar115);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar116,local_480);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar116,local_4a0);
            auVar116 = vfmadd231ps_avx512vl(auVar115,local_120,auVar116);
            auVar115 = vfmadd231ps_avx512vl(auVar114,auVar103,auVar192);
            auVar114 = vfmadd231ps_avx512vl(auVar107,auVar103,auVar200);
            auVar103 = vfmadd231ps_avx512vl(auVar116,local_180,auVar103);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar105,auVar188);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar105,auVar189);
            auVar107 = vfmadd231ps_avx512vl(auVar103,local_160,auVar105);
            auVar105 = *(undefined1 (*) [32])(lVar73 + 0x222a914 + lVar87 * 4);
            auVar103 = *(undefined1 (*) [32])(lVar73 + 0x222b21c + lVar87 * 4);
            auVar116 = *(undefined1 (*) [32])(lVar73 + 0x222b6a0 + lVar87 * 4);
            auVar113 = vmulps_avx512vl(local_4c0,auVar116);
            auVar127 = vmulps_avx512vl(local_4e0,auVar116);
            auVar116 = vmulps_avx512vl(local_140,auVar116);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar103,local_480);
            auVar127 = vfmadd231ps_avx512vl(auVar127,auVar103,local_4a0);
            auVar116 = vfmadd231ps_avx512vl(auVar116,local_120,auVar103);
            auVar103 = *(undefined1 (*) [32])(lVar73 + 0x222ad98 + lVar87 * 4);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar103,auVar192);
            auVar127 = vfmadd231ps_avx512vl(auVar127,auVar103,auVar200);
            auVar103 = vfmadd231ps_avx512vl(auVar116,local_180,auVar103);
            auVar116 = vfmadd231ps_avx512vl(auVar113,auVar105,auVar188);
            auVar113 = vfmadd231ps_avx512vl(auVar127,auVar105,auVar189);
            auVar103 = vfmadd231ps_avx512vl(auVar103,local_160,auVar105);
            auVar127 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar115,auVar127);
            vandps_avx512vl(auVar114,auVar127);
            auVar105 = vmaxps_avx(auVar127,auVar127);
            vandps_avx512vl(auVar107,auVar127);
            auVar105 = vmaxps_avx(auVar105,auVar127);
            auVar78._4_4_ = uStack_3fc;
            auVar78._0_4_ = local_400;
            auVar78._8_4_ = uStack_3f8;
            auVar78._12_4_ = uStack_3f4;
            auVar78._16_4_ = uStack_3f0;
            auVar78._20_4_ = uStack_3ec;
            auVar78._24_4_ = uStack_3e8;
            auVar78._28_4_ = uStack_3e4;
            uVar81 = vcmpps_avx512vl(auVar105,auVar78,1);
            bVar16 = (bool)((byte)uVar81 & 1);
            auVar129._0_4_ = (float)((uint)bVar16 * auVar108._0_4_ | (uint)!bVar16 * auVar115._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar16 * auVar108._4_4_ | (uint)!bVar16 * auVar115._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar16 * auVar108._8_4_ | (uint)!bVar16 * auVar115._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar16 * auVar108._12_4_ | (uint)!bVar16 * auVar115._12_4_);
            bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
            auVar129._16_4_ =
                 (float)((uint)bVar16 * auVar108._16_4_ | (uint)!bVar16 * auVar115._16_4_);
            bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
            auVar129._20_4_ =
                 (float)((uint)bVar16 * auVar108._20_4_ | (uint)!bVar16 * auVar115._20_4_);
            bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
            auVar129._24_4_ =
                 (float)((uint)bVar16 * auVar108._24_4_ | (uint)!bVar16 * auVar115._24_4_);
            bVar16 = SUB81(uVar81 >> 7,0);
            auVar129._28_4_ = (uint)bVar16 * auVar108._28_4_ | (uint)!bVar16 * auVar115._28_4_;
            bVar16 = (bool)((byte)uVar81 & 1);
            auVar130._0_4_ = (float)((uint)bVar16 * auVar109._0_4_ | (uint)!bVar16 * auVar114._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar16 * auVar109._4_4_ | (uint)!bVar16 * auVar114._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar16 * auVar109._8_4_ | (uint)!bVar16 * auVar114._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * auVar114._12_4_);
            bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
            auVar130._16_4_ =
                 (float)((uint)bVar16 * auVar109._16_4_ | (uint)!bVar16 * auVar114._16_4_);
            bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
            auVar130._20_4_ =
                 (float)((uint)bVar16 * auVar109._20_4_ | (uint)!bVar16 * auVar114._20_4_);
            bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
            auVar130._24_4_ =
                 (float)((uint)bVar16 * auVar109._24_4_ | (uint)!bVar16 * auVar114._24_4_);
            bVar16 = SUB81(uVar81 >> 7,0);
            auVar130._28_4_ = (uint)bVar16 * auVar109._28_4_ | (uint)!bVar16 * auVar114._28_4_;
            vandps_avx512vl(auVar116,auVar127);
            vandps_avx512vl(auVar113,auVar127);
            auVar105 = vmaxps_avx(auVar130,auVar130);
            vandps_avx512vl(auVar103,auVar127);
            auVar105 = vmaxps_avx(auVar105,auVar130);
            uVar81 = vcmpps_avx512vl(auVar105,auVar78,1);
            bVar16 = (bool)((byte)uVar81 & 1);
            auVar131._0_4_ = (uint)bVar16 * auVar108._0_4_ | (uint)!bVar16 * auVar116._0_4_;
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar131._4_4_ = (uint)bVar16 * auVar108._4_4_ | (uint)!bVar16 * auVar116._4_4_;
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar131._8_4_ = (uint)bVar16 * auVar108._8_4_ | (uint)!bVar16 * auVar116._8_4_;
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar131._12_4_ = (uint)bVar16 * auVar108._12_4_ | (uint)!bVar16 * auVar116._12_4_;
            bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
            auVar131._16_4_ = (uint)bVar16 * auVar108._16_4_ | (uint)!bVar16 * auVar116._16_4_;
            bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
            auVar131._20_4_ = (uint)bVar16 * auVar108._20_4_ | (uint)!bVar16 * auVar116._20_4_;
            bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
            auVar131._24_4_ = (uint)bVar16 * auVar108._24_4_ | (uint)!bVar16 * auVar116._24_4_;
            bVar16 = SUB81(uVar81 >> 7,0);
            auVar131._28_4_ = (uint)bVar16 * auVar108._28_4_ | (uint)!bVar16 * auVar116._28_4_;
            bVar16 = (bool)((byte)uVar81 & 1);
            auVar132._0_4_ = (float)((uint)bVar16 * auVar109._0_4_ | (uint)!bVar16 * auVar113._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar132._4_4_ = (float)((uint)bVar16 * auVar109._4_4_ | (uint)!bVar16 * auVar113._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar132._8_4_ = (float)((uint)bVar16 * auVar109._8_4_ | (uint)!bVar16 * auVar113._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar132._12_4_ =
                 (float)((uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * auVar113._12_4_);
            bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
            auVar132._16_4_ =
                 (float)((uint)bVar16 * auVar109._16_4_ | (uint)!bVar16 * auVar113._16_4_);
            bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
            auVar132._20_4_ =
                 (float)((uint)bVar16 * auVar109._20_4_ | (uint)!bVar16 * auVar113._20_4_);
            bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
            auVar132._24_4_ =
                 (float)((uint)bVar16 * auVar109._24_4_ | (uint)!bVar16 * auVar113._24_4_);
            bVar16 = SUB81(uVar81 >> 7,0);
            auVar132._28_4_ = (uint)bVar16 * auVar109._28_4_ | (uint)!bVar16 * auVar113._28_4_;
            auVar196._8_4_ = 0x80000000;
            auVar196._0_8_ = 0x8000000080000000;
            auVar196._12_4_ = 0x80000000;
            auVar196._16_4_ = 0x80000000;
            auVar196._20_4_ = 0x80000000;
            auVar196._24_4_ = 0x80000000;
            auVar196._28_4_ = 0x80000000;
            auVar105 = vxorps_avx512vl(auVar131,auVar196);
            auVar113 = auVar205._0_32_;
            auVar103 = vfmadd213ps_avx512vl(auVar129,auVar129,auVar113);
            auVar96 = vfmadd231ps_fma(auVar103,auVar130,auVar130);
            auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar96));
            auVar203._8_4_ = 0xbf000000;
            auVar203._0_8_ = 0xbf000000bf000000;
            auVar203._12_4_ = 0xbf000000;
            auVar203._16_4_ = 0xbf000000;
            auVar203._20_4_ = 0xbf000000;
            auVar203._24_4_ = 0xbf000000;
            auVar203._28_4_ = 0xbf000000;
            fVar167 = auVar103._0_4_;
            fVar147 = auVar103._4_4_;
            fVar181 = auVar103._8_4_;
            fVar182 = auVar103._12_4_;
            fVar183 = auVar103._16_4_;
            fVar174 = auVar103._20_4_;
            fVar175 = auVar103._24_4_;
            auVar56._4_4_ = fVar147 * fVar147 * fVar147 * auVar96._4_4_ * -0.5;
            auVar56._0_4_ = fVar167 * fVar167 * fVar167 * auVar96._0_4_ * -0.5;
            auVar56._8_4_ = fVar181 * fVar181 * fVar181 * auVar96._8_4_ * -0.5;
            auVar56._12_4_ = fVar182 * fVar182 * fVar182 * auVar96._12_4_ * -0.5;
            auVar56._16_4_ = fVar183 * fVar183 * fVar183 * -0.0;
            auVar56._20_4_ = fVar174 * fVar174 * fVar174 * -0.0;
            auVar56._24_4_ = fVar175 * fVar175 * fVar175 * -0.0;
            auVar56._28_4_ = auVar130._28_4_;
            auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar103 = vfmadd231ps_avx512vl(auVar56,auVar116,auVar103);
            auVar57._4_4_ = auVar130._4_4_ * auVar103._4_4_;
            auVar57._0_4_ = auVar130._0_4_ * auVar103._0_4_;
            auVar57._8_4_ = auVar130._8_4_ * auVar103._8_4_;
            auVar57._12_4_ = auVar130._12_4_ * auVar103._12_4_;
            auVar57._16_4_ = auVar130._16_4_ * auVar103._16_4_;
            auVar57._20_4_ = auVar130._20_4_ * auVar103._20_4_;
            auVar57._24_4_ = auVar130._24_4_ * auVar103._24_4_;
            auVar57._28_4_ = 0;
            auVar58._4_4_ = auVar103._4_4_ * -auVar129._4_4_;
            auVar58._0_4_ = auVar103._0_4_ * -auVar129._0_4_;
            auVar58._8_4_ = auVar103._8_4_ * -auVar129._8_4_;
            auVar58._12_4_ = auVar103._12_4_ * -auVar129._12_4_;
            auVar58._16_4_ = auVar103._16_4_ * -auVar129._16_4_;
            auVar58._20_4_ = auVar103._20_4_ * -auVar129._20_4_;
            auVar58._24_4_ = auVar103._24_4_ * -auVar129._24_4_;
            auVar58._28_4_ = auVar130._28_4_;
            auVar115 = vmulps_avx512vl(auVar103,auVar113);
            auVar103 = vfmadd213ps_avx512vl(auVar131,auVar131,auVar113);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar132,auVar132);
            auVar114 = vrsqrt14ps_avx512vl(auVar103);
            auVar103 = vmulps_avx512vl(auVar103,auVar203);
            fVar167 = auVar114._0_4_;
            fVar147 = auVar114._4_4_;
            fVar181 = auVar114._8_4_;
            fVar182 = auVar114._12_4_;
            fVar183 = auVar114._16_4_;
            fVar174 = auVar114._20_4_;
            fVar175 = auVar114._24_4_;
            auVar59._4_4_ = fVar147 * fVar147 * fVar147 * auVar103._4_4_;
            auVar59._0_4_ = fVar167 * fVar167 * fVar167 * auVar103._0_4_;
            auVar59._8_4_ = fVar181 * fVar181 * fVar181 * auVar103._8_4_;
            auVar59._12_4_ = fVar182 * fVar182 * fVar182 * auVar103._12_4_;
            auVar59._16_4_ = fVar183 * fVar183 * fVar183 * auVar103._16_4_;
            auVar59._20_4_ = fVar174 * fVar174 * fVar174 * auVar103._20_4_;
            auVar59._24_4_ = fVar175 * fVar175 * fVar175 * auVar103._24_4_;
            auVar59._28_4_ = auVar103._28_4_;
            auVar103 = vfmadd231ps_avx512vl(auVar59,auVar116,auVar114);
            auVar60._4_4_ = auVar132._4_4_ * auVar103._4_4_;
            auVar60._0_4_ = auVar132._0_4_ * auVar103._0_4_;
            auVar60._8_4_ = auVar132._8_4_ * auVar103._8_4_;
            auVar60._12_4_ = auVar132._12_4_ * auVar103._12_4_;
            auVar60._16_4_ = auVar132._16_4_ * auVar103._16_4_;
            auVar60._20_4_ = auVar132._20_4_ * auVar103._20_4_;
            auVar60._24_4_ = auVar132._24_4_ * auVar103._24_4_;
            auVar60._28_4_ = auVar114._28_4_;
            auVar61._4_4_ = auVar103._4_4_ * auVar105._4_4_;
            auVar61._0_4_ = auVar103._0_4_ * auVar105._0_4_;
            auVar61._8_4_ = auVar103._8_4_ * auVar105._8_4_;
            auVar61._12_4_ = auVar103._12_4_ * auVar105._12_4_;
            auVar61._16_4_ = auVar103._16_4_ * auVar105._16_4_;
            auVar61._20_4_ = auVar103._20_4_ * auVar105._20_4_;
            auVar61._24_4_ = auVar103._24_4_ * auVar105._24_4_;
            auVar61._28_4_ = auVar105._28_4_;
            auVar105 = vmulps_avx512vl(auVar103,auVar113);
            auVar96 = vfmadd213ps_fma(auVar57,auVar111,auVar102);
            auVar94 = vfmadd213ps_fma(auVar58,auVar111,auVar110);
            auVar116 = vfmadd213ps_avx512vl(auVar115,auVar111,auVar104);
            auVar114 = vfmadd213ps_avx512vl(auVar60,auVar112,auVar100);
            auVar10 = vfnmadd213ps_fma(auVar57,auVar111,auVar102);
            auVar204 = vfmadd213ps_fma(auVar61,auVar112,auVar101);
            auVar11 = vfnmadd213ps_fma(auVar58,auVar111,auVar110);
            auVar6 = vfmadd213ps_fma(auVar105,auVar112,auVar106);
            auVar157 = vfnmadd231ps_fma(auVar104,auVar111,auVar115);
            auVar149 = vfnmadd213ps_fma(auVar60,auVar112,auVar100);
            auVar95 = vfnmadd213ps_fma(auVar61,auVar112,auVar101);
            auVar97 = vfnmadd231ps_fma(auVar106,auVar112,auVar105);
            auVar106 = vsubps_avx512vl(auVar114,ZEXT1632(auVar10));
            auVar105 = vsubps_avx(ZEXT1632(auVar204),ZEXT1632(auVar11));
            auVar103 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar157));
            auVar62._4_4_ = auVar105._4_4_ * auVar157._4_4_;
            auVar62._0_4_ = auVar105._0_4_ * auVar157._0_4_;
            auVar62._8_4_ = auVar105._8_4_ * auVar157._8_4_;
            auVar62._12_4_ = auVar105._12_4_ * auVar157._12_4_;
            auVar62._16_4_ = auVar105._16_4_ * 0.0;
            auVar62._20_4_ = auVar105._20_4_ * 0.0;
            auVar62._24_4_ = auVar105._24_4_ * 0.0;
            auVar62._28_4_ = auVar115._28_4_;
            auVar7 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar11),auVar103);
            auVar63._4_4_ = auVar103._4_4_ * auVar10._4_4_;
            auVar63._0_4_ = auVar103._0_4_ * auVar10._0_4_;
            auVar63._8_4_ = auVar103._8_4_ * auVar10._8_4_;
            auVar63._12_4_ = auVar103._12_4_ * auVar10._12_4_;
            auVar63._16_4_ = auVar103._16_4_ * 0.0;
            auVar63._20_4_ = auVar103._20_4_ * 0.0;
            auVar63._24_4_ = auVar103._24_4_ * 0.0;
            auVar63._28_4_ = auVar103._28_4_;
            auVar8 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar157),auVar106);
            auVar64._4_4_ = auVar11._4_4_ * auVar106._4_4_;
            auVar64._0_4_ = auVar11._0_4_ * auVar106._0_4_;
            auVar64._8_4_ = auVar11._8_4_ * auVar106._8_4_;
            auVar64._12_4_ = auVar11._12_4_ * auVar106._12_4_;
            auVar64._16_4_ = auVar106._16_4_ * 0.0;
            auVar64._20_4_ = auVar106._20_4_ * 0.0;
            auVar64._24_4_ = auVar106._24_4_ * 0.0;
            auVar64._28_4_ = auVar106._28_4_;
            auVar9 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar10),auVar105);
            auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar113,ZEXT1632(auVar8));
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar113,ZEXT1632(auVar7));
            uVar81 = vcmpps_avx512vl(auVar105,auVar113,2);
            bVar15 = (byte)uVar81;
            fVar92 = (float)((uint)(bVar15 & 1) * auVar96._0_4_ |
                            (uint)!(bool)(bVar15 & 1) * auVar149._0_4_);
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            fVar141 = (float)((uint)bVar16 * auVar96._4_4_ | (uint)!bVar16 * auVar149._4_4_);
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            fVar143 = (float)((uint)bVar16 * auVar96._8_4_ | (uint)!bVar16 * auVar149._8_4_);
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            fVar145 = (float)((uint)bVar16 * auVar96._12_4_ | (uint)!bVar16 * auVar149._12_4_);
            auVar107 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar143,CONCAT44(fVar141,fVar92))));
            fVar93 = (float)((uint)(bVar15 & 1) * auVar94._0_4_ |
                            (uint)!(bool)(bVar15 & 1) * auVar95._0_4_);
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            fVar142 = (float)((uint)bVar16 * auVar94._4_4_ | (uint)!bVar16 * auVar95._4_4_);
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            fVar144 = (float)((uint)bVar16 * auVar94._8_4_ | (uint)!bVar16 * auVar95._8_4_);
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            fVar146 = (float)((uint)bVar16 * auVar94._12_4_ | (uint)!bVar16 * auVar95._12_4_);
            auVar108 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar144,CONCAT44(fVar142,fVar93))));
            auVar133._0_4_ =
                 (float)((uint)(bVar15 & 1) * auVar116._0_4_ |
                        (uint)!(bool)(bVar15 & 1) * auVar97._0_4_);
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar133._4_4_ = (float)((uint)bVar16 * auVar116._4_4_ | (uint)!bVar16 * auVar97._4_4_);
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar133._8_4_ = (float)((uint)bVar16 * auVar116._8_4_ | (uint)!bVar16 * auVar97._8_4_);
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar133._12_4_ =
                 (float)((uint)bVar16 * auVar116._12_4_ | (uint)!bVar16 * auVar97._12_4_);
            fVar181 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar116._16_4_);
            auVar133._16_4_ = fVar181;
            fVar167 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar116._20_4_);
            auVar133._20_4_ = fVar167;
            fVar147 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar116._24_4_);
            auVar133._24_4_ = fVar147;
            iVar1 = (uint)(byte)(uVar81 >> 7) * auVar116._28_4_;
            auVar133._28_4_ = iVar1;
            auVar105 = vblendmps_avx512vl(ZEXT1632(auVar10),auVar114);
            auVar134._0_4_ =
                 (uint)(bVar15 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar7._0_4_;
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar134._4_4_ = (uint)bVar16 * auVar105._4_4_ | (uint)!bVar16 * auVar7._4_4_;
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar134._8_4_ = (uint)bVar16 * auVar105._8_4_ | (uint)!bVar16 * auVar7._8_4_;
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar134._12_4_ = (uint)bVar16 * auVar105._12_4_ | (uint)!bVar16 * auVar7._12_4_;
            auVar134._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * auVar105._16_4_;
            auVar134._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * auVar105._20_4_;
            auVar134._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * auVar105._24_4_;
            auVar134._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar105._28_4_;
            auVar105 = vblendmps_avx512vl(ZEXT1632(auVar11),ZEXT1632(auVar204));
            auVar135._0_4_ =
                 (float)((uint)(bVar15 & 1) * auVar105._0_4_ |
                        (uint)!(bool)(bVar15 & 1) * auVar96._0_4_);
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar135._4_4_ = (float)((uint)bVar16 * auVar105._4_4_ | (uint)!bVar16 * auVar96._4_4_);
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar135._8_4_ = (float)((uint)bVar16 * auVar105._8_4_ | (uint)!bVar16 * auVar96._8_4_);
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar135._12_4_ =
                 (float)((uint)bVar16 * auVar105._12_4_ | (uint)!bVar16 * auVar96._12_4_);
            fVar174 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar105._16_4_);
            auVar135._16_4_ = fVar174;
            fVar182 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar105._20_4_);
            auVar135._20_4_ = fVar182;
            fVar183 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar105._24_4_);
            auVar135._24_4_ = fVar183;
            auVar135._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar105._28_4_;
            auVar105 = vblendmps_avx512vl(ZEXT1632(auVar157),ZEXT1632(auVar6));
            auVar136._0_4_ =
                 (float)((uint)(bVar15 & 1) * auVar105._0_4_ |
                        (uint)!(bool)(bVar15 & 1) * auVar94._0_4_);
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar136._4_4_ = (float)((uint)bVar16 * auVar105._4_4_ | (uint)!bVar16 * auVar94._4_4_);
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar136._8_4_ = (float)((uint)bVar16 * auVar105._8_4_ | (uint)!bVar16 * auVar94._8_4_);
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar136._12_4_ =
                 (float)((uint)bVar16 * auVar105._12_4_ | (uint)!bVar16 * auVar94._12_4_);
            fVar166 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar105._16_4_);
            auVar136._16_4_ = fVar166;
            fVar175 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar105._20_4_);
            auVar136._20_4_ = fVar175;
            fVar176 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar105._24_4_);
            auVar136._24_4_ = fVar176;
            iVar2 = (uint)(byte)(uVar81 >> 7) * auVar105._28_4_;
            auVar136._28_4_ = iVar2;
            auVar137._0_4_ =
                 (uint)(bVar15 & 1) * (int)auVar10._0_4_ |
                 (uint)!(bool)(bVar15 & 1) * auVar114._0_4_;
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar137._4_4_ = (uint)bVar16 * (int)auVar10._4_4_ | (uint)!bVar16 * auVar114._4_4_;
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar137._8_4_ = (uint)bVar16 * (int)auVar10._8_4_ | (uint)!bVar16 * auVar114._8_4_;
            bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar137._12_4_ = (uint)bVar16 * (int)auVar10._12_4_ | (uint)!bVar16 * auVar114._12_4_;
            auVar137._16_4_ = (uint)!(bool)((byte)(uVar81 >> 4) & 1) * auVar114._16_4_;
            auVar137._20_4_ = (uint)!(bool)((byte)(uVar81 >> 5) & 1) * auVar114._20_4_;
            auVar137._24_4_ = (uint)!(bool)((byte)(uVar81 >> 6) & 1) * auVar114._24_4_;
            auVar137._28_4_ = (uint)!SUB81(uVar81 >> 7,0) * auVar114._28_4_;
            bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar81 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar81 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar114 = vsubps_avx512vl(auVar137,auVar107);
            auVar103 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar11._12_4_ |
                                                     (uint)!bVar20 * auVar204._12_4_,
                                                     CONCAT48((uint)bVar18 * (int)auVar11._8_4_ |
                                                              (uint)!bVar18 * auVar204._8_4_,
                                                              CONCAT44((uint)bVar16 *
                                                                       (int)auVar11._4_4_ |
                                                                       (uint)!bVar16 *
                                                                       auVar204._4_4_,
                                                                       (uint)(bVar15 & 1) *
                                                                       (int)auVar11._0_4_ |
                                                                       (uint)!(bool)(bVar15 & 1) *
                                                                       auVar204._0_4_)))),auVar108);
            auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar157._12_4_ |
                                                     (uint)!bVar21 * auVar6._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar157._8_4_ |
                                                              (uint)!bVar19 * auVar6._8_4_,
                                                              CONCAT44((uint)bVar17 *
                                                                       (int)auVar157._4_4_ |
                                                                       (uint)!bVar17 * auVar6._4_4_,
                                                                       (uint)(bVar15 & 1) *
                                                                       (int)auVar157._0_4_ |
                                                                       (uint)!(bool)(bVar15 & 1) *
                                                                       auVar6._0_4_)))),auVar133);
            auVar115 = vsubps_avx(auVar107,auVar134);
            auVar106 = vsubps_avx(auVar108,auVar135);
            auVar104 = vsubps_avx(auVar133,auVar136);
            auVar65._4_4_ = auVar116._4_4_ * fVar141;
            auVar65._0_4_ = auVar116._0_4_ * fVar92;
            auVar65._8_4_ = auVar116._8_4_ * fVar143;
            auVar65._12_4_ = auVar116._12_4_ * fVar145;
            auVar65._16_4_ = auVar116._16_4_ * 0.0;
            auVar65._20_4_ = auVar116._20_4_ * 0.0;
            auVar65._24_4_ = auVar116._24_4_ * 0.0;
            auVar65._28_4_ = 0;
            auVar96 = vfmsub231ps_fma(auVar65,auVar133,auVar114);
            auVar173._0_4_ = fVar93 * auVar114._0_4_;
            auVar173._4_4_ = fVar142 * auVar114._4_4_;
            auVar173._8_4_ = fVar144 * auVar114._8_4_;
            auVar173._12_4_ = fVar146 * auVar114._12_4_;
            auVar173._16_4_ = auVar114._16_4_ * 0.0;
            auVar173._20_4_ = auVar114._20_4_ * 0.0;
            auVar173._24_4_ = auVar114._24_4_ * 0.0;
            auVar173._28_4_ = 0;
            auVar94 = vfmsub231ps_fma(auVar173,auVar107,auVar103);
            auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar113,ZEXT1632(auVar96));
            auVar179._0_4_ = auVar103._0_4_ * auVar133._0_4_;
            auVar179._4_4_ = auVar103._4_4_ * auVar133._4_4_;
            auVar179._8_4_ = auVar103._8_4_ * auVar133._8_4_;
            auVar179._12_4_ = auVar103._12_4_ * auVar133._12_4_;
            auVar179._16_4_ = auVar103._16_4_ * fVar181;
            auVar179._20_4_ = auVar103._20_4_ * fVar167;
            auVar179._24_4_ = auVar103._24_4_ * fVar147;
            auVar179._28_4_ = 0;
            auVar96 = vfmsub231ps_fma(auVar179,auVar108,auVar116);
            auVar109 = vfmadd231ps_avx512vl(auVar105,auVar113,ZEXT1632(auVar96));
            auVar105 = vmulps_avx512vl(auVar104,auVar134);
            auVar105 = vfmsub231ps_avx512vl(auVar105,auVar115,auVar136);
            auVar66._4_4_ = auVar106._4_4_ * auVar136._4_4_;
            auVar66._0_4_ = auVar106._0_4_ * auVar136._0_4_;
            auVar66._8_4_ = auVar106._8_4_ * auVar136._8_4_;
            auVar66._12_4_ = auVar106._12_4_ * auVar136._12_4_;
            auVar66._16_4_ = auVar106._16_4_ * fVar166;
            auVar66._20_4_ = auVar106._20_4_ * fVar175;
            auVar66._24_4_ = auVar106._24_4_ * fVar176;
            auVar66._28_4_ = iVar2;
            auVar96 = vfmsub231ps_fma(auVar66,auVar135,auVar104);
            auVar180._0_4_ = auVar135._0_4_ * auVar115._0_4_;
            auVar180._4_4_ = auVar135._4_4_ * auVar115._4_4_;
            auVar180._8_4_ = auVar135._8_4_ * auVar115._8_4_;
            auVar180._12_4_ = auVar135._12_4_ * auVar115._12_4_;
            auVar180._16_4_ = fVar174 * auVar115._16_4_;
            auVar180._20_4_ = fVar182 * auVar115._20_4_;
            auVar180._24_4_ = fVar183 * auVar115._24_4_;
            auVar180._28_4_ = 0;
            auVar94 = vfmsub231ps_fma(auVar180,auVar106,auVar134);
            auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar113,auVar105);
            auVar102 = vfmadd231ps_avx512vl(auVar105,auVar113,ZEXT1632(auVar96));
            auVar105 = vmaxps_avx(auVar109,auVar102);
            uVar23 = vcmpps_avx512vl(auVar105,auVar113,2);
            bVar91 = bVar91 & (byte)uVar23;
            auVar213 = ZEXT3264(auVar200);
            if (bVar91 == 0) {
LAB_01d85378:
              bVar91 = 0;
            }
            else {
              auVar67._4_4_ = auVar104._4_4_ * auVar103._4_4_;
              auVar67._0_4_ = auVar104._0_4_ * auVar103._0_4_;
              auVar67._8_4_ = auVar104._8_4_ * auVar103._8_4_;
              auVar67._12_4_ = auVar104._12_4_ * auVar103._12_4_;
              auVar67._16_4_ = auVar104._16_4_ * auVar103._16_4_;
              auVar67._20_4_ = auVar104._20_4_ * auVar103._20_4_;
              auVar67._24_4_ = auVar104._24_4_ * auVar103._24_4_;
              auVar67._28_4_ = auVar105._28_4_;
              auVar204 = vfmsub231ps_fma(auVar67,auVar106,auVar116);
              auVar68._4_4_ = auVar116._4_4_ * auVar115._4_4_;
              auVar68._0_4_ = auVar116._0_4_ * auVar115._0_4_;
              auVar68._8_4_ = auVar116._8_4_ * auVar115._8_4_;
              auVar68._12_4_ = auVar116._12_4_ * auVar115._12_4_;
              auVar68._16_4_ = auVar116._16_4_ * auVar115._16_4_;
              auVar68._20_4_ = auVar116._20_4_ * auVar115._20_4_;
              auVar68._24_4_ = auVar116._24_4_ * auVar115._24_4_;
              auVar68._28_4_ = auVar116._28_4_;
              auVar94 = vfmsub231ps_fma(auVar68,auVar114,auVar104);
              auVar69._4_4_ = auVar106._4_4_ * auVar114._4_4_;
              auVar69._0_4_ = auVar106._0_4_ * auVar114._0_4_;
              auVar69._8_4_ = auVar106._8_4_ * auVar114._8_4_;
              auVar69._12_4_ = auVar106._12_4_ * auVar114._12_4_;
              auVar69._16_4_ = auVar106._16_4_ * auVar114._16_4_;
              auVar69._20_4_ = auVar106._20_4_ * auVar114._20_4_;
              auVar69._24_4_ = auVar106._24_4_ * auVar114._24_4_;
              auVar69._28_4_ = auVar106._28_4_;
              auVar6 = vfmsub231ps_fma(auVar69,auVar115,auVar103);
              auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar94),ZEXT1632(auVar6));
              auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar204),auVar113);
              auVar103 = vrcp14ps_avx512vl(auVar105);
              auVar31._8_4_ = 0x3f800000;
              auVar31._0_8_ = &DAT_3f8000003f800000;
              auVar31._12_4_ = 0x3f800000;
              auVar31._16_4_ = 0x3f800000;
              auVar31._20_4_ = 0x3f800000;
              auVar31._24_4_ = 0x3f800000;
              auVar31._28_4_ = 0x3f800000;
              auVar116 = vfnmadd213ps_avx512vl(auVar103,auVar105,auVar31);
              auVar96 = vfmadd132ps_fma(auVar116,auVar103,auVar103);
              auVar70._4_4_ = auVar6._4_4_ * auVar133._4_4_;
              auVar70._0_4_ = auVar6._0_4_ * auVar133._0_4_;
              auVar70._8_4_ = auVar6._8_4_ * auVar133._8_4_;
              auVar70._12_4_ = auVar6._12_4_ * auVar133._12_4_;
              auVar70._16_4_ = fVar181 * 0.0;
              auVar70._20_4_ = fVar167 * 0.0;
              auVar70._24_4_ = fVar147 * 0.0;
              auVar70._28_4_ = iVar1;
              auVar94 = vfmadd231ps_fma(auVar70,auVar108,ZEXT1632(auVar94));
              auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar107,ZEXT1632(auVar204));
              fVar147 = auVar96._0_4_;
              fVar181 = auVar96._4_4_;
              fVar182 = auVar96._8_4_;
              fVar183 = auVar96._12_4_;
              auVar103 = ZEXT1632(CONCAT412(auVar94._12_4_ * fVar183,
                                            CONCAT48(auVar94._8_4_ * fVar182,
                                                     CONCAT44(auVar94._4_4_ * fVar181,
                                                              auVar94._0_4_ * fVar147))));
              auVar79._4_4_ = uStack_1dc;
              auVar79._0_4_ = local_1e0;
              auVar79._8_4_ = uStack_1d8;
              auVar79._12_4_ = uStack_1d4;
              auVar79._16_4_ = uStack_1d0;
              auVar79._20_4_ = uStack_1cc;
              auVar79._24_4_ = uStack_1c8;
              auVar79._28_4_ = uStack_1c4;
              uVar23 = vcmpps_avx512vl(auVar103,auVar79,0xd);
              fVar167 = (ray->super_RayK<1>).tfar;
              auVar32._4_4_ = fVar167;
              auVar32._0_4_ = fVar167;
              auVar32._8_4_ = fVar167;
              auVar32._12_4_ = fVar167;
              auVar32._16_4_ = fVar167;
              auVar32._20_4_ = fVar167;
              auVar32._24_4_ = fVar167;
              auVar32._28_4_ = fVar167;
              uVar24 = vcmpps_avx512vl(auVar103,auVar32,2);
              bVar91 = (byte)uVar23 & (byte)uVar24 & bVar91;
              if (bVar91 == 0) goto LAB_01d85378;
              uVar23 = vcmpps_avx512vl(auVar105,auVar113,4);
              if ((bVar91 & (byte)uVar23) == 0) goto LAB_01d85378;
              bVar91 = bVar91 & (byte)uVar23;
              fVar167 = auVar109._0_4_ * fVar147;
              fVar174 = auVar109._4_4_ * fVar181;
              auVar71._4_4_ = fVar174;
              auVar71._0_4_ = fVar167;
              fVar175 = auVar109._8_4_ * fVar182;
              auVar71._8_4_ = fVar175;
              fVar176 = auVar109._12_4_ * fVar183;
              auVar71._12_4_ = fVar176;
              fVar166 = auVar109._16_4_ * 0.0;
              auVar71._16_4_ = fVar166;
              fVar92 = auVar109._20_4_ * 0.0;
              auVar71._20_4_ = fVar92;
              fVar93 = auVar109._24_4_ * 0.0;
              auVar71._24_4_ = fVar93;
              auVar71._28_4_ = auVar109._28_4_;
              fVar147 = auVar102._0_4_ * fVar147;
              fVar181 = auVar102._4_4_ * fVar181;
              auVar72._4_4_ = fVar181;
              auVar72._0_4_ = fVar147;
              fVar182 = auVar102._8_4_ * fVar182;
              auVar72._8_4_ = fVar182;
              fVar183 = auVar102._12_4_ * fVar183;
              auVar72._12_4_ = fVar183;
              fVar141 = auVar102._16_4_ * 0.0;
              auVar72._16_4_ = fVar141;
              fVar142 = auVar102._20_4_ * 0.0;
              auVar72._20_4_ = fVar142;
              fVar143 = auVar102._24_4_ * 0.0;
              auVar72._24_4_ = fVar143;
              auVar72._28_4_ = auVar102._28_4_;
              auVar191._8_4_ = 0x3f800000;
              auVar191._0_8_ = &DAT_3f8000003f800000;
              auVar191._12_4_ = 0x3f800000;
              auVar191._16_4_ = 0x3f800000;
              auVar191._20_4_ = 0x3f800000;
              auVar191._24_4_ = 0x3f800000;
              auVar191._28_4_ = 0x3f800000;
              auVar105 = vsubps_avx(auVar191,auVar71);
              local_500._0_4_ =
                   (uint)(bVar15 & 1) * (int)fVar167 | (uint)!(bool)(bVar15 & 1) * auVar105._0_4_;
              bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
              local_500._4_4_ = (uint)bVar16 * (int)fVar174 | (uint)!bVar16 * auVar105._4_4_;
              bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
              local_500._8_4_ = (uint)bVar16 * (int)fVar175 | (uint)!bVar16 * auVar105._8_4_;
              bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
              local_500._12_4_ = (uint)bVar16 * (int)fVar176 | (uint)!bVar16 * auVar105._12_4_;
              bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
              local_500._16_4_ = (uint)bVar16 * (int)fVar166 | (uint)!bVar16 * auVar105._16_4_;
              bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
              local_500._20_4_ = (uint)bVar16 * (int)fVar92 | (uint)!bVar16 * auVar105._20_4_;
              bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
              local_500._24_4_ = (uint)bVar16 * (int)fVar93 | (uint)!bVar16 * auVar105._24_4_;
              bVar16 = SUB81(uVar81 >> 7,0);
              local_500._28_4_ = (uint)bVar16 * auVar109._28_4_ | (uint)!bVar16 * auVar105._28_4_;
              auVar105 = vsubps_avx(auVar191,auVar72);
              bVar16 = (bool)((byte)(uVar81 >> 1) & 1);
              bVar17 = (bool)((byte)(uVar81 >> 2) & 1);
              bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
              bVar19 = (bool)((byte)(uVar81 >> 4) & 1);
              bVar20 = (bool)((byte)(uVar81 >> 5) & 1);
              bVar21 = (bool)((byte)(uVar81 >> 6) & 1);
              bVar22 = SUB81(uVar81 >> 7,0);
              local_200._4_4_ = (uint)bVar16 * (int)fVar181 | (uint)!bVar16 * auVar105._4_4_;
              local_200._0_4_ =
                   (uint)(bVar15 & 1) * (int)fVar147 | (uint)!(bool)(bVar15 & 1) * auVar105._0_4_;
              local_200._8_4_ = (uint)bVar17 * (int)fVar182 | (uint)!bVar17 * auVar105._8_4_;
              local_200._12_4_ = (uint)bVar18 * (int)fVar183 | (uint)!bVar18 * auVar105._12_4_;
              local_200._16_4_ = (uint)bVar19 * (int)fVar141 | (uint)!bVar19 * auVar105._16_4_;
              local_200._20_4_ = (uint)bVar20 * (int)fVar142 | (uint)!bVar20 * auVar105._20_4_;
              local_200._24_4_ = (uint)bVar21 * (int)fVar143 | (uint)!bVar21 * auVar105._24_4_;
              local_200._28_4_ = (uint)bVar22 * auVar102._28_4_ | (uint)!bVar22 * auVar105._28_4_;
              local_520 = auVar103;
            }
            if (bVar91 != 0) {
              auVar105 = vsubps_avx(auVar112,auVar111);
              auVar96 = vfmadd213ps_fma(auVar105,local_500,auVar111);
              fVar167 = pre->depth_scale;
              auVar33._4_4_ = fVar167;
              auVar33._0_4_ = fVar167;
              auVar33._8_4_ = fVar167;
              auVar33._12_4_ = fVar167;
              auVar33._16_4_ = fVar167;
              auVar33._20_4_ = fVar167;
              auVar33._24_4_ = fVar167;
              auVar33._28_4_ = fVar167;
              auVar105 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar96._12_4_ + auVar96._12_4_,
                                                            CONCAT48(auVar96._8_4_ + auVar96._8_4_,
                                                                     CONCAT44(auVar96._4_4_ +
                                                                              auVar96._4_4_,
                                                                              auVar96._0_4_ +
                                                                              auVar96._0_4_)))),
                                         auVar33);
              uVar23 = vcmpps_avx512vl(local_520,auVar105,6);
              bVar91 = bVar91 & (byte)uVar23;
              if (bVar91 != 0) {
                auVar153._8_4_ = 0xbf800000;
                auVar153._0_8_ = 0xbf800000bf800000;
                auVar153._12_4_ = 0xbf800000;
                auVar153._16_4_ = 0xbf800000;
                auVar153._20_4_ = 0xbf800000;
                auVar153._24_4_ = 0xbf800000;
                auVar153._28_4_ = 0xbf800000;
                auVar34._8_4_ = 0x40000000;
                auVar34._0_8_ = 0x4000000040000000;
                auVar34._12_4_ = 0x40000000;
                auVar34._16_4_ = 0x40000000;
                auVar34._20_4_ = 0x40000000;
                auVar34._24_4_ = 0x40000000;
                auVar34._28_4_ = 0x40000000;
                local_200 = vfmadd132ps_avx512vl(local_200,auVar153,auVar34);
                local_320 = local_500;
                auVar105 = local_200;
                local_300 = local_200;
                local_2e0 = local_520;
                local_2c0 = (int)lVar87;
                local_2bc = iVar13;
                local_2b0 = local_5a0._0_8_;
                uStack_2a8 = local_5a0._8_8_;
                local_2a0 = local_530._0_8_;
                uStack_298 = local_530._8_8_;
                local_290 = local_540._0_8_;
                uStack_288 = local_540._8_8_;
                local_280 = local_550;
                uStack_278 = uStack_548;
                local_270 = bVar91;
                pGVar89 = (context->scene->geometries).items[local_5e0].ptr;
                local_200 = auVar105;
                if ((pGVar89->mask & (ray->super_RayK<1>).mask) != 0) {
                  auVar96 = vcvtsi2ss_avx512f(auVar127._0_16_,(int)lVar87);
                  fVar167 = auVar96._0_4_;
                  local_260[0] = (fVar167 + local_500._0_4_ + 0.0) * (float)local_340._0_4_;
                  local_260[1] = (fVar167 + local_500._4_4_ + 1.0) * (float)local_340._4_4_;
                  local_260[2] = (fVar167 + local_500._8_4_ + 2.0) * fStack_338;
                  local_260[3] = (fVar167 + local_500._12_4_ + 3.0) * fStack_334;
                  fStack_250 = (fVar167 + local_500._16_4_ + 4.0) * fStack_330;
                  fStack_24c = (fVar167 + local_500._20_4_ + 5.0) * fStack_32c;
                  fStack_248 = (fVar167 + local_500._24_4_ + 6.0) * fStack_328;
                  fStack_244 = fVar167 + local_500._28_4_ + 7.0;
                  local_240 = local_200._0_8_;
                  uStack_238 = local_200._8_8_;
                  uStack_230 = local_200._16_8_;
                  uStack_228 = local_200._24_8_;
                  local_220 = local_520;
                  auVar154._8_4_ = 0x7f800000;
                  auVar154._0_8_ = 0x7f8000007f800000;
                  auVar154._12_4_ = 0x7f800000;
                  auVar154._16_4_ = 0x7f800000;
                  auVar154._20_4_ = 0x7f800000;
                  auVar154._24_4_ = 0x7f800000;
                  auVar154._28_4_ = 0x7f800000;
                  auVar103 = vblendmps_avx512vl(auVar154,local_520);
                  auVar138._0_4_ =
                       (uint)(bVar91 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar91 & 1) * 0x7f800000;
                  bVar16 = (bool)(bVar91 >> 1 & 1);
                  auVar138._4_4_ = (uint)bVar16 * auVar103._4_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(bVar91 >> 2 & 1);
                  auVar138._8_4_ = (uint)bVar16 * auVar103._8_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(bVar91 >> 3 & 1);
                  auVar138._12_4_ = (uint)bVar16 * auVar103._12_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(bVar91 >> 4 & 1);
                  auVar138._16_4_ = (uint)bVar16 * auVar103._16_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(bVar91 >> 5 & 1);
                  auVar138._20_4_ = (uint)bVar16 * auVar103._20_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(bVar91 >> 6 & 1);
                  auVar138._24_4_ = (uint)bVar16 * auVar103._24_4_ | (uint)!bVar16 * 0x7f800000;
                  auVar138._28_4_ =
                       (uint)(bVar91 >> 7) * auVar103._28_4_ |
                       (uint)!(bool)(bVar91 >> 7) * 0x7f800000;
                  auVar103 = vshufps_avx(auVar138,auVar138,0xb1);
                  auVar103 = vminps_avx(auVar138,auVar103);
                  auVar116 = vshufpd_avx(auVar103,auVar103,5);
                  auVar103 = vminps_avx(auVar103,auVar116);
                  auVar116 = vpermpd_avx2(auVar103,0x4e);
                  auVar103 = vminps_avx(auVar103,auVar116);
                  uVar23 = vcmpps_avx512vl(auVar138,auVar103,0);
                  bVar80 = (byte)uVar23 & bVar91;
                  bVar15 = bVar91;
                  if (bVar80 != 0) {
                    bVar15 = bVar80;
                  }
                  uVar90 = 0;
                  for (uVar84 = (uint)bVar15; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000)
                  {
                    uVar90 = uVar90 + 1;
                  }
                  uVar81 = (ulong)uVar90;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar89->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar167 = local_260[uVar81];
                    fVar147 = *(float *)((long)&local_240 + uVar81 * 4);
                    fVar182 = 1.0 - fVar167;
                    fVar181 = fVar182 * fVar182 * -3.0;
                    auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar182 * fVar182)),
                                              ZEXT416((uint)(fVar167 * fVar182)),ZEXT416(0xc0000000)
                                             );
                    auVar94 = vfmsub132ss_fma(ZEXT416((uint)(fVar167 * fVar182)),
                                              ZEXT416((uint)(fVar167 * fVar167)),ZEXT416(0x40000000)
                                             );
                    fVar182 = auVar96._0_4_ * 3.0;
                    fVar183 = auVar94._0_4_ * 3.0;
                    fVar174 = fVar167 * fVar167 * 3.0;
                    auVar185._0_4_ = fVar174 * (float)local_550._0_4_;
                    auVar185._4_4_ = fVar174 * (float)local_550._4_4_;
                    auVar185._8_4_ = fVar174 * (float)uStack_548;
                    auVar185._12_4_ = fVar174 * uStack_548._4_4_;
                    auVar160._4_4_ = fVar183;
                    auVar160._0_4_ = fVar183;
                    auVar160._8_4_ = fVar183;
                    auVar160._12_4_ = fVar183;
                    auVar96 = vfmadd132ps_fma(auVar160,auVar185,local_540);
                    auVar169._4_4_ = fVar182;
                    auVar169._0_4_ = fVar182;
                    auVar169._8_4_ = fVar182;
                    auVar169._12_4_ = fVar182;
                    auVar96 = vfmadd132ps_fma(auVar169,auVar96,local_530);
                    auVar161._4_4_ = fVar181;
                    auVar161._0_4_ = fVar181;
                    auVar161._8_4_ = fVar181;
                    auVar161._12_4_ = fVar181;
                    (ray->super_RayK<1>).tfar = *(float *)(local_220 + uVar81 * 4);
                    auVar96 = vfmadd132ps_fma(auVar161,auVar96,local_5a0);
                    uVar23 = vmovlps_avx(auVar96);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar23;
                    fVar181 = (float)vextractps_avx(auVar96,2);
                    (ray->Ng).field_0.field_0.z = fVar181;
                    ray->u = fVar167;
                    ray->v = fVar147;
                    ray->primID = (uint)local_5d8;
                    ray->geomID = (uint)local_5e0;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    local_410 = local_530._0_8_;
                    uStack_408 = local_530._8_8_;
                    local_420 = local_540._0_8_;
                    uStack_418 = local_540._8_8_;
                    local_430 = local_550;
                    uStack_428 = uStack_548;
                    local_558 = pGVar89;
                    local_5f0 = prim;
                    local_5f8 = pre;
                    local_1a0 = vmovdqa64_avx512vl(auVar214._0_32_);
                    do {
                      auVar204 = auVar205._0_16_;
                      local_584 = local_260[uVar81];
                      local_580 = *(undefined4 *)((long)&local_240 + uVar81 * 4);
                      fVar167 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_220 + uVar81 * 4);
                      local_5d0.context = context->user;
                      fVar181 = 1.0 - local_584;
                      fVar147 = fVar181 * fVar181 * -3.0;
                      auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar181 * fVar181)),
                                                ZEXT416((uint)(local_584 * fVar181)),
                                                ZEXT416(0xc0000000));
                      auVar94 = vfmsub132ss_fma(ZEXT416((uint)(local_584 * fVar181)),
                                                ZEXT416((uint)(local_584 * local_584)),
                                                ZEXT416(0x40000000));
                      fVar181 = auVar96._0_4_ * 3.0;
                      fVar182 = auVar94._0_4_ * 3.0;
                      fVar183 = local_584 * local_584 * 3.0;
                      auVar186._0_4_ = fVar183 * (float)local_430;
                      auVar186._4_4_ = fVar183 * local_430._4_4_;
                      auVar186._8_4_ = fVar183 * (float)uStack_428;
                      auVar186._12_4_ = fVar183 * uStack_428._4_4_;
                      auVar162._4_4_ = fVar182;
                      auVar162._0_4_ = fVar182;
                      auVar162._8_4_ = fVar182;
                      auVar162._12_4_ = fVar182;
                      auVar74._8_8_ = uStack_418;
                      auVar74._0_8_ = local_420;
                      auVar96 = vfmadd132ps_fma(auVar162,auVar186,auVar74);
                      auVar170._4_4_ = fVar181;
                      auVar170._0_4_ = fVar181;
                      auVar170._8_4_ = fVar181;
                      auVar170._12_4_ = fVar181;
                      auVar76._8_8_ = uStack_408;
                      auVar76._0_8_ = local_410;
                      auVar96 = vfmadd132ps_fma(auVar170,auVar96,auVar76);
                      auVar163._4_4_ = fVar147;
                      auVar163._0_4_ = fVar147;
                      auVar163._8_4_ = fVar147;
                      auVar163._12_4_ = fVar147;
                      auVar96 = vfmadd132ps_fma(auVar163,auVar96,local_5a0);
                      local_590 = vmovlps_avx(auVar96);
                      local_588 = vextractps_avx(auVar96,2);
                      local_57c = (int)local_5d8;
                      local_578 = (int)local_5e0;
                      local_574 = (local_5d0.context)->instID[0];
                      local_570 = (local_5d0.context)->instPrimID[0];
                      local_5fc = -1;
                      local_5d0.valid = &local_5fc;
                      local_5d0.geometryUserPtr = pGVar89->userPtr;
                      local_5d0.ray = (RTCRayN *)ray;
                      local_5d0.hit = (RTCHitN *)&local_590;
                      local_5d0.N = 1;
                      local_5e8 = CONCAT44(local_5e8._4_4_,(uint)bVar91);
                      if (pGVar89->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d855e2:
                        auVar96 = auVar205._0_16_;
                        p_Var14 = context->args->filter;
                        if (p_Var14 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar89->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var14)(&local_5d0);
                            bVar91 = (byte)local_5e8;
                            auVar105 = vmovdqa64_avx512vl(local_1a0);
                            auVar214 = ZEXT3264(auVar105);
                            auVar212 = ZEXT3264(local_4e0);
                            auVar211 = ZEXT3264(local_4c0);
                            auVar210 = ZEXT3264(local_4a0);
                            auVar209 = ZEXT3264(local_480);
                            auVar213 = ZEXT3264(local_3c0);
                            auVar208 = ZEXT3264(local_3a0);
                            auVar207 = ZEXT3264(local_380);
                            auVar206 = ZEXT3264(local_360);
                            auVar96 = vxorps_avx512vl(auVar96,auVar96);
                            auVar205 = ZEXT1664(auVar96);
                            prim = local_5f0;
                            pGVar89 = local_558;
                            pre = local_5f8;
                          }
                          if (*local_5d0.valid == 0) goto LAB_01d856dc;
                        }
                        (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).components[0] =
                             *(float *)local_5d0.hit;
                        (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_5d0.hit + 4);
                        (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_5d0.hit + 8);
                        *(float *)((long)local_5d0.ray + 0x3c) = *(float *)(local_5d0.hit + 0xc);
                        *(float *)((long)local_5d0.ray + 0x40) = *(float *)(local_5d0.hit + 0x10);
                        *(float *)((long)local_5d0.ray + 0x44) = *(float *)(local_5d0.hit + 0x14);
                        *(float *)((long)local_5d0.ray + 0x48) = *(float *)(local_5d0.hit + 0x18);
                        *(float *)((long)local_5d0.ray + 0x4c) = *(float *)(local_5d0.hit + 0x1c);
                        *(float *)((long)local_5d0.ray + 0x50) = *(float *)(local_5d0.hit + 0x20);
                      }
                      else {
                        (*pGVar89->intersectionFilterN)(&local_5d0);
                        bVar91 = (byte)local_5e8;
                        auVar105 = vmovdqa64_avx512vl(local_1a0);
                        auVar214 = ZEXT3264(auVar105);
                        auVar212 = ZEXT3264(local_4e0);
                        auVar211 = ZEXT3264(local_4c0);
                        auVar210 = ZEXT3264(local_4a0);
                        auVar209 = ZEXT3264(local_480);
                        auVar213 = ZEXT3264(local_3c0);
                        auVar208 = ZEXT3264(local_3a0);
                        auVar207 = ZEXT3264(local_380);
                        auVar206 = ZEXT3264(local_360);
                        auVar96 = vxorps_avx512vl(auVar204,auVar204);
                        auVar205 = ZEXT1664(auVar96);
                        prim = local_5f0;
                        pGVar89 = local_558;
                        pre = local_5f8;
                        if (*local_5d0.valid != 0) goto LAB_01d855e2;
LAB_01d856dc:
                        (ray->super_RayK<1>).tfar = fVar167;
                      }
                      bVar15 = ~(byte)(1 << ((uint)uVar81 & 0x1f)) & bVar91;
                      fVar167 = (ray->super_RayK<1>).tfar;
                      auVar35._4_4_ = fVar167;
                      auVar35._0_4_ = fVar167;
                      auVar35._8_4_ = fVar167;
                      auVar35._12_4_ = fVar167;
                      auVar35._16_4_ = fVar167;
                      auVar35._20_4_ = fVar167;
                      auVar35._24_4_ = fVar167;
                      auVar35._28_4_ = fVar167;
                      uVar23 = vcmpps_avx512vl(local_520,auVar35,2);
                      bVar91 = bVar15 & (byte)uVar23;
                      if ((bVar15 & (byte)uVar23) != 0) {
                        auVar155._8_4_ = 0x7f800000;
                        auVar155._0_8_ = 0x7f8000007f800000;
                        auVar155._12_4_ = 0x7f800000;
                        auVar155._16_4_ = 0x7f800000;
                        auVar155._20_4_ = 0x7f800000;
                        auVar155._24_4_ = 0x7f800000;
                        auVar155._28_4_ = 0x7f800000;
                        auVar105 = vblendmps_avx512vl(auVar155,local_520);
                        auVar139._0_4_ =
                             (uint)(bVar91 & 1) * auVar105._0_4_ |
                             (uint)!(bool)(bVar91 & 1) * 0x7f800000;
                        bVar16 = (bool)(bVar91 >> 1 & 1);
                        auVar139._4_4_ = (uint)bVar16 * auVar105._4_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar91 >> 2 & 1);
                        auVar139._8_4_ = (uint)bVar16 * auVar105._8_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar91 >> 3 & 1);
                        auVar139._12_4_ =
                             (uint)bVar16 * auVar105._12_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar91 >> 4 & 1);
                        auVar139._16_4_ =
                             (uint)bVar16 * auVar105._16_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar91 >> 5 & 1);
                        auVar139._20_4_ =
                             (uint)bVar16 * auVar105._20_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar91 >> 6 & 1);
                        auVar139._24_4_ =
                             (uint)bVar16 * auVar105._24_4_ | (uint)!bVar16 * 0x7f800000;
                        auVar139._28_4_ =
                             (uint)(bVar91 >> 7) * auVar105._28_4_ |
                             (uint)!(bool)(bVar91 >> 7) * 0x7f800000;
                        auVar105 = vshufps_avx(auVar139,auVar139,0xb1);
                        auVar105 = vminps_avx(auVar139,auVar105);
                        auVar103 = vshufpd_avx(auVar105,auVar105,5);
                        auVar105 = vminps_avx(auVar105,auVar103);
                        auVar103 = vpermpd_avx2(auVar105,0x4e);
                        auVar105 = vminps_avx(auVar105,auVar103);
                        uVar23 = vcmpps_avx512vl(auVar139,auVar105,0);
                        bVar80 = (byte)uVar23 & bVar91;
                        bVar15 = bVar91;
                        if (bVar80 != 0) {
                          bVar15 = bVar80;
                        }
                        uVar90 = 0;
                        for (uVar84 = (uint)bVar15; (uVar84 & 1) == 0;
                            uVar84 = uVar84 >> 1 | 0x80000000) {
                          uVar90 = uVar90 + 1;
                        }
                        uVar81 = (ulong)uVar90;
                      }
                    } while (bVar91 != 0);
                  }
                }
              }
            }
          }
          lVar87 = lVar87 + 8;
        } while ((int)lVar87 < iVar13);
      }
      fVar167 = (ray->super_RayK<1>).tfar;
      auVar30._4_4_ = fVar167;
      auVar30._0_4_ = fVar167;
      auVar30._8_4_ = fVar167;
      auVar30._12_4_ = fVar167;
      auVar30._16_4_ = fVar167;
      auVar30._20_4_ = fVar167;
      auVar30._24_4_ = fVar167;
      auVar30._28_4_ = fVar167;
      uVar23 = vcmpps_avx512vl(local_80,auVar30,2);
      uVar90 = (uint)uVar88 & (uint)uVar88 + 0xff & (uint)uVar23;
      uVar88 = (ulong)uVar90;
    } while (uVar90 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }